

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar53;
  byte bVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  uint uVar61;
  bool bVar62;
  float fVar63;
  float fVar88;
  float fVar89;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar90;
  undefined1 auVar66 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar91;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar95;
  float fVar121;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar96;
  float fVar97;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar116 [32];
  undefined1 auVar100 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float t1;
  float fVar150;
  float fVar157;
  float fVar158;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar160;
  undefined1 auVar156 [32];
  float fVar178;
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar179;
  float fVar197;
  float fVar198;
  vint4 ai_2;
  undefined1 auVar180 [16];
  float fVar199;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar201;
  float fVar215;
  float fVar216;
  undefined1 auVar202 [16];
  float fVar217;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [64];
  vfloat4 b0;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar239;
  float fVar241;
  vint4 ai_1;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar238 [32];
  float fVar244;
  float fVar259;
  float fVar260;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar257 [32];
  float fVar261;
  undefined1 auVar258 [32];
  __m128 a;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  vfloat4 a0;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar284;
  float fVar285;
  vfloat4 a0_1;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  undefined1 auVar283 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar298;
  undefined1 auVar297 [64];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar304;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 auStack_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint auStack_4a0 [4];
  RTCFilterFunctionNArguments local_490;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar213 [32];
  undefined1 auVar303 [32];
  
  PVar4 = prim[1];
  uVar60 = (ulong)(byte)PVar4;
  auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar205 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar179 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar146 = vsubps_avx(auVar146,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar124._0_4_ = fVar179 * auVar146._0_4_;
  auVar124._4_4_ = fVar179 * auVar146._4_4_;
  auVar124._8_4_ = fVar179 * auVar146._8_4_;
  auVar124._12_4_ = fVar179 * auVar146._12_4_;
  auVar218._0_4_ = fVar179 * auVar205._0_4_;
  auVar218._4_4_ = fVar179 * auVar205._4_4_;
  auVar218._8_4_ = fVar179 * auVar205._8_4_;
  auVar218._12_4_ = fVar179 * auVar205._12_4_;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar273 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar60 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar57 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + uVar60 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar57 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar64 = vshufps_avx(auVar218,auVar218,0);
  auVar98 = vshufps_avx(auVar218,auVar218,0x55);
  auVar125 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar179 = auVar125._0_4_;
  fVar150 = auVar125._4_4_;
  fVar197 = auVar125._8_4_;
  fVar157 = auVar125._12_4_;
  fVar201 = auVar98._0_4_;
  fVar215 = auVar98._4_4_;
  fVar216 = auVar98._8_4_;
  fVar217 = auVar98._12_4_;
  fVar198 = auVar64._0_4_;
  fVar158 = auVar64._4_4_;
  fVar199 = auVar64._8_4_;
  fVar159 = auVar64._12_4_;
  auVar280._0_4_ = fVar198 * auVar146._0_4_ + fVar201 * auVar205._0_4_ + fVar179 * auVar144._0_4_;
  auVar280._4_4_ = fVar158 * auVar146._4_4_ + fVar215 * auVar205._4_4_ + fVar150 * auVar144._4_4_;
  auVar280._8_4_ = fVar199 * auVar146._8_4_ + fVar216 * auVar205._8_4_ + fVar197 * auVar144._8_4_;
  auVar280._12_4_ =
       fVar159 * auVar146._12_4_ + fVar217 * auVar205._12_4_ + fVar157 * auVar144._12_4_;
  auVar291._0_4_ = fVar198 * auVar11._0_4_ + fVar201 * auVar273._0_4_ + auVar12._0_4_ * fVar179;
  auVar291._4_4_ = fVar158 * auVar11._4_4_ + fVar215 * auVar273._4_4_ + auVar12._4_4_ * fVar150;
  auVar291._8_4_ = fVar199 * auVar11._8_4_ + fVar216 * auVar273._8_4_ + auVar12._8_4_ * fVar197;
  auVar291._12_4_ = fVar159 * auVar11._12_4_ + fVar217 * auVar273._12_4_ + auVar12._12_4_ * fVar157;
  auVar219._0_4_ = fVar198 * auVar65._0_4_ + fVar201 * auVar102._0_4_ + auVar134._0_4_ * fVar179;
  auVar219._4_4_ = fVar158 * auVar65._4_4_ + fVar215 * auVar102._4_4_ + auVar134._4_4_ * fVar150;
  auVar219._8_4_ = fVar199 * auVar65._8_4_ + fVar216 * auVar102._8_4_ + auVar134._8_4_ * fVar197;
  auVar219._12_4_ = fVar159 * auVar65._12_4_ + fVar217 * auVar102._12_4_ + auVar134._12_4_ * fVar157
  ;
  auVar64 = vshufps_avx(auVar124,auVar124,0);
  auVar98 = vshufps_avx(auVar124,auVar124,0x55);
  auVar125 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar179 = auVar125._0_4_;
  fVar150 = auVar125._4_4_;
  fVar197 = auVar125._8_4_;
  fVar157 = auVar125._12_4_;
  fVar201 = auVar98._0_4_;
  fVar215 = auVar98._4_4_;
  fVar216 = auVar98._8_4_;
  fVar217 = auVar98._12_4_;
  fVar198 = auVar64._0_4_;
  fVar158 = auVar64._4_4_;
  fVar199 = auVar64._8_4_;
  fVar159 = auVar64._12_4_;
  auVar161._0_4_ = fVar198 * auVar146._0_4_ + fVar201 * auVar205._0_4_ + fVar179 * auVar144._0_4_;
  auVar161._4_4_ = fVar158 * auVar146._4_4_ + fVar215 * auVar205._4_4_ + fVar150 * auVar144._4_4_;
  auVar161._8_4_ = fVar199 * auVar146._8_4_ + fVar216 * auVar205._8_4_ + fVar197 * auVar144._8_4_;
  auVar161._12_4_ =
       fVar159 * auVar146._12_4_ + fVar217 * auVar205._12_4_ + fVar157 * auVar144._12_4_;
  auVar98._0_4_ = fVar198 * auVar11._0_4_ + auVar12._0_4_ * fVar179 + fVar201 * auVar273._0_4_;
  auVar98._4_4_ = fVar158 * auVar11._4_4_ + auVar12._4_4_ * fVar150 + fVar215 * auVar273._4_4_;
  auVar98._8_4_ = fVar199 * auVar11._8_4_ + auVar12._8_4_ * fVar197 + fVar216 * auVar273._8_4_;
  auVar98._12_4_ = fVar159 * auVar11._12_4_ + auVar12._12_4_ * fVar157 + fVar217 * auVar273._12_4_;
  auVar64._0_4_ = fVar198 * auVar65._0_4_ + fVar201 * auVar102._0_4_ + auVar134._0_4_ * fVar179;
  auVar64._4_4_ = fVar158 * auVar65._4_4_ + fVar215 * auVar102._4_4_ + auVar134._4_4_ * fVar150;
  auVar64._8_4_ = fVar199 * auVar65._8_4_ + fVar216 * auVar102._8_4_ + auVar134._8_4_ * fVar197;
  auVar64._12_4_ = fVar159 * auVar65._12_4_ + fVar217 * auVar102._12_4_ + auVar134._12_4_ * fVar157;
  auVar202._8_4_ = 0x7fffffff;
  auVar202._0_8_ = 0x7fffffff7fffffff;
  auVar202._12_4_ = 0x7fffffff;
  auVar146 = vandps_avx(auVar280,auVar202);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar146 = vcmpps_avx(auVar146,auVar151,1);
  auVar205 = vblendvps_avx(auVar280,auVar151,auVar146);
  auVar146 = vandps_avx(auVar291,auVar202);
  auVar146 = vcmpps_avx(auVar146,auVar151,1);
  auVar144 = vblendvps_avx(auVar291,auVar151,auVar146);
  auVar146 = vandps_avx(auVar219,auVar202);
  auVar146 = vcmpps_avx(auVar146,auVar151,1);
  auVar146 = vblendvps_avx(auVar219,auVar151,auVar146);
  auVar11 = vrcpps_avx(auVar205);
  fVar201 = auVar11._0_4_;
  auVar125._0_4_ = fVar201 * auVar205._0_4_;
  fVar215 = auVar11._4_4_;
  auVar125._4_4_ = fVar215 * auVar205._4_4_;
  fVar216 = auVar11._8_4_;
  auVar125._8_4_ = fVar216 * auVar205._8_4_;
  fVar217 = auVar11._12_4_;
  auVar125._12_4_ = fVar217 * auVar205._12_4_;
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar205 = vsubps_avx(auVar220,auVar125);
  fVar201 = fVar201 + fVar201 * auVar205._0_4_;
  fVar215 = fVar215 + fVar215 * auVar205._4_4_;
  fVar216 = fVar216 + fVar216 * auVar205._8_4_;
  fVar217 = fVar217 + fVar217 * auVar205._12_4_;
  auVar205 = vrcpps_avx(auVar144);
  fVar179 = auVar205._0_4_;
  auVar180._0_4_ = fVar179 * auVar144._0_4_;
  fVar197 = auVar205._4_4_;
  auVar180._4_4_ = fVar197 * auVar144._4_4_;
  fVar198 = auVar205._8_4_;
  auVar180._8_4_ = fVar198 * auVar144._8_4_;
  fVar199 = auVar205._12_4_;
  auVar180._12_4_ = fVar199 * auVar144._12_4_;
  auVar205 = vsubps_avx(auVar220,auVar180);
  fVar179 = fVar179 + fVar179 * auVar205._0_4_;
  fVar197 = fVar197 + fVar197 * auVar205._4_4_;
  fVar198 = fVar198 + fVar198 * auVar205._8_4_;
  fVar199 = fVar199 + fVar199 * auVar205._12_4_;
  auVar205 = vrcpps_avx(auVar146);
  fVar150 = auVar205._0_4_;
  auVar152._0_4_ = fVar150 * auVar146._0_4_;
  fVar157 = auVar205._4_4_;
  auVar152._4_4_ = fVar157 * auVar146._4_4_;
  fVar158 = auVar205._8_4_;
  auVar152._8_4_ = fVar158 * auVar146._8_4_;
  fVar159 = auVar205._12_4_;
  auVar152._12_4_ = fVar159 * auVar146._12_4_;
  auVar146 = vsubps_avx(auVar220,auVar152);
  fVar150 = fVar150 + fVar150 * auVar146._0_4_;
  fVar157 = fVar157 + fVar157 * auVar146._4_4_;
  fVar158 = fVar158 + fVar158 * auVar146._8_4_;
  fVar159 = fVar159 + fVar159 * auVar146._12_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar161);
  auVar126._0_4_ = fVar201 * auVar146._0_4_;
  auVar126._4_4_ = fVar215 * auVar146._4_4_;
  auVar126._8_4_ = fVar216 * auVar146._8_4_;
  auVar126._12_4_ = fVar217 * auVar146._12_4_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar146 = vpmovsxwd_avx(auVar205);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar161);
  auVar162._0_4_ = fVar201 * auVar146._0_4_;
  auVar162._4_4_ = fVar215 * auVar146._4_4_;
  auVar162._8_4_ = fVar216 * auVar146._8_4_;
  auVar162._12_4_ = fVar217 * auVar146._12_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar205 = vpmovsxwd_avx(auVar144);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar60 * -2 + 6);
  auVar146 = vpmovsxwd_avx(auVar11);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar98);
  auVar230._0_4_ = auVar146._0_4_ * fVar179;
  auVar230._4_4_ = auVar146._4_4_ * fVar197;
  auVar230._8_4_ = auVar146._8_4_ * fVar198;
  auVar230._12_4_ = auVar146._12_4_ * fVar199;
  auVar146 = vcvtdq2ps_avx(auVar205);
  auVar146 = vsubps_avx(auVar146,auVar98);
  auVar134._0_4_ = fVar179 * auVar146._0_4_;
  auVar134._4_4_ = fVar197 * auVar146._4_4_;
  auVar134._8_4_ = fVar198 * auVar146._8_4_;
  auVar134._12_4_ = fVar199 * auVar146._12_4_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + uVar57 + uVar60 + 6);
  auVar146 = vpmovsxwd_avx(auVar273);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar64);
  auVar181._0_4_ = auVar146._0_4_ * fVar150;
  auVar181._4_4_ = auVar146._4_4_ * fVar157;
  auVar181._8_4_ = auVar146._8_4_ * fVar158;
  auVar181._12_4_ = auVar146._12_4_ * fVar159;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar146 = vpmovsxwd_avx(auVar12);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar64);
  auVar65._0_4_ = auVar146._0_4_ * fVar150;
  auVar65._4_4_ = auVar146._4_4_ * fVar157;
  auVar65._8_4_ = auVar146._8_4_ * fVar158;
  auVar65._12_4_ = auVar146._12_4_ * fVar159;
  auVar146 = vpminsd_avx(auVar126,auVar162);
  auVar205 = vpminsd_avx(auVar230,auVar134);
  auVar146 = vmaxps_avx(auVar146,auVar205);
  auVar205 = vpminsd_avx(auVar181,auVar65);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar245._4_4_ = uVar2;
  auVar245._0_4_ = uVar2;
  auVar245._8_4_ = uVar2;
  auVar245._12_4_ = uVar2;
  auVar205 = vmaxps_avx(auVar205,auVar245);
  auVar146 = vmaxps_avx(auVar146,auVar205);
  local_410._0_4_ = auVar146._0_4_ * 0.99999964;
  local_410._4_4_ = auVar146._4_4_ * 0.99999964;
  local_410._8_4_ = auVar146._8_4_ * 0.99999964;
  local_410._12_4_ = auVar146._12_4_ * 0.99999964;
  auVar146 = vpmaxsd_avx(auVar126,auVar162);
  auVar205 = vpmaxsd_avx(auVar230,auVar134);
  auVar146 = vminps_avx(auVar146,auVar205);
  auVar205 = vpmaxsd_avx(auVar181,auVar65);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar127._4_4_ = uVar2;
  auVar127._0_4_ = uVar2;
  auVar127._8_4_ = uVar2;
  auVar127._12_4_ = uVar2;
  auVar205 = vminps_avx(auVar205,auVar127);
  auVar146 = vminps_avx(auVar146,auVar205);
  auVar102._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar102._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar102._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar102._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar146 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar205 = vpcmpgtd_avx(auVar146,_DAT_01f7fcf0);
  auVar146 = vcmpps_avx(local_410,auVar102,2);
  auVar146 = vandps_avx(auVar146,auVar205);
  uVar53 = vmovmskps_avx(auVar146);
  if (uVar53 == 0) {
    return false;
  }
  uVar53 = uVar53 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  uVar58 = 1 << ((byte)k & 0x1f);
LAB_00e3f1d0:
  uVar57 = (ulong)uVar53;
  lVar56 = 0;
  if (uVar57 != 0) {
    for (; (uVar53 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
    }
  }
  uVar53 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar53].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar56 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar146 = *(undefined1 (*) [16])(_Var8 + uVar60 * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (uVar60 + 1) * (long)pvVar7);
  fVar179 = *pfVar1;
  fVar150 = pfVar1[1];
  fVar197 = pfVar1[2];
  fVar157 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar60 + 2) * (long)pvVar7);
  fVar198 = *pfVar1;
  fVar158 = pfVar1[1];
  fVar199 = pfVar1[2];
  fVar159 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar60 + 3));
  fVar201 = *pfVar1;
  fVar215 = pfVar1[1];
  fVar216 = pfVar1[2];
  fVar217 = pfVar1[3];
  uVar57 = uVar57 - 1 & uVar57;
  lVar9 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * uVar60);
  fVar63 = *pfVar1;
  fVar88 = pfVar1[1];
  fVar89 = pfVar1[2];
  fVar90 = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar60 + 1));
  fVar95 = *pfVar1;
  fVar96 = pfVar1[1];
  fVar97 = pfVar1[2];
  fVar121 = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar60 + 2));
  fVar122 = *pfVar1;
  fVar123 = pfVar1[1];
  fVar91 = pfVar1[2];
  fVar92 = pfVar1[3];
  lVar10 = 0;
  if (uVar57 != 0) {
    for (; (uVar57 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar60 + 3));
  fVar93 = *pfVar1;
  fVar94 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar200 = pfVar1[3];
  if (((uVar57 != 0) && (uVar60 = uVar57 - 1 & uVar57, uVar60 != 0)) && (lVar9 = 0, uVar60 != 0)) {
    for (; (uVar60 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar144 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_680._0_4_ = fVar63 * 0.16666667 + fVar95 * 0.6666667 + fVar122 * 0.16666667 + fVar93 * 0.0;
  local_680._4_4_ = fVar88 * 0.16666667 + fVar96 * 0.6666667 + fVar123 * 0.16666667 + fVar94 * 0.0;
  fStack_678 = fVar89 * 0.16666667 + fVar97 * 0.6666667 + fVar91 * 0.16666667 + fVar160 * 0.0;
  fStack_674 = fVar90 * 0.16666667 + fVar121 * 0.6666667 + fVar92 * 0.16666667 + fVar200 * 0.0;
  auVar128._0_4_ = fVar122 * 0.5 + fVar93 * 0.0;
  auVar128._4_4_ = fVar123 * 0.5 + fVar94 * 0.0;
  auVar128._8_4_ = fVar91 * 0.5 + fVar160 * 0.0;
  auVar128._12_4_ = fVar92 * 0.5 + fVar200 * 0.0;
  auVar270._0_4_ = fVar95 * 0.0;
  auVar270._4_4_ = fVar96 * 0.0;
  auVar270._8_4_ = fVar97 * 0.0;
  auVar270._12_4_ = fVar121 * 0.0;
  auVar205 = vsubps_avx(auVar128,auVar270);
  auVar271._0_4_ = fVar63 * 0.5;
  auVar271._4_4_ = fVar88 * 0.5;
  auVar271._8_4_ = fVar89 * 0.5;
  auVar271._12_4_ = fVar90 * 0.5;
  auVar134 = vsubps_avx(auVar205,auVar271);
  fVar178 = auVar146._0_4_;
  fVar229 = auVar146._4_4_;
  fVar239 = auVar146._8_4_;
  fVar240 = auVar146._12_4_;
  auVar272._0_4_ = fVar178 * 0.16666667 + fVar179 * 0.6666667 + fVar198 * 0.16666667 + fVar201 * 0.0
  ;
  auVar272._4_4_ = fVar229 * 0.16666667 + fVar150 * 0.6666667 + fVar158 * 0.16666667 + fVar215 * 0.0
  ;
  auVar272._8_4_ = fVar239 * 0.16666667 + fVar197 * 0.6666667 + fVar199 * 0.16666667 + fVar216 * 0.0
  ;
  auVar272._12_4_ =
       fVar240 * 0.16666667 + fVar157 * 0.6666667 + fVar159 * 0.16666667 + fVar217 * 0.0;
  auVar281._0_4_ = fVar198 * 0.5 + fVar201 * 0.0;
  auVar281._4_4_ = fVar158 * 0.5 + fVar215 * 0.0;
  auVar281._8_4_ = fVar199 * 0.5 + fVar216 * 0.0;
  auVar281._12_4_ = fVar159 * 0.5 + fVar217 * 0.0;
  auVar292._0_4_ = fVar179 * 0.0;
  auVar292._4_4_ = fVar150 * 0.0;
  auVar292._8_4_ = fVar197 * 0.0;
  auVar292._12_4_ = fVar157 * 0.0;
  auVar146 = vsubps_avx(auVar281,auVar292);
  auVar293._0_4_ = fVar178 * 0.5;
  auVar293._4_4_ = fVar229 * 0.5;
  auVar293._8_4_ = fVar239 * 0.5;
  auVar293._12_4_ = fVar240 * 0.5;
  auVar273 = vsubps_avx(auVar146,auVar293);
  auVar299._0_4_ = fVar63 * 0.0;
  auVar299._4_4_ = fVar88 * 0.0;
  auVar299._8_4_ = fVar89 * 0.0;
  auVar299._12_4_ = fVar90 * 0.0;
  local_620._0_4_ = auVar299._0_4_ + fVar95 * 0.16666667 + fVar122 * 0.6666667 + fVar93 * 0.16666667
  ;
  local_620._4_4_ = auVar299._4_4_ + fVar96 * 0.16666667 + fVar123 * 0.6666667 + fVar94 * 0.16666667
  ;
  fStack_618 = auVar299._8_4_ + fVar97 * 0.16666667 + fVar91 * 0.6666667 + fVar160 * 0.16666667;
  fStack_614 = auVar299._12_4_ + fVar121 * 0.16666667 + fVar92 * 0.6666667 + fVar200 * 0.16666667;
  auVar246._0_4_ = fVar122 * 0.0 + fVar93 * 0.5;
  auVar246._4_4_ = fVar123 * 0.0 + fVar94 * 0.5;
  auVar246._8_4_ = fVar91 * 0.0 + fVar160 * 0.5;
  auVar246._12_4_ = fVar92 * 0.0 + fVar200 * 0.5;
  auVar163._0_4_ = fVar95 * 0.5;
  auVar163._4_4_ = fVar96 * 0.5;
  auVar163._8_4_ = fVar97 * 0.5;
  auVar163._12_4_ = fVar121 * 0.5;
  auVar146 = vsubps_avx(auVar246,auVar163);
  auVar64 = vsubps_avx(auVar146,auVar299);
  auVar203._0_4_ = fVar178 * 0.0;
  auVar203._4_4_ = fVar229 * 0.0;
  auVar203._8_4_ = fVar239 * 0.0;
  auVar203._12_4_ = fVar240 * 0.0;
  auVar247._0_4_ =
       fVar179 * 0.16666667 + fVar198 * 0.6666667 + fVar201 * 0.16666667 + auVar203._0_4_;
  auVar247._4_4_ =
       fVar150 * 0.16666667 + fVar158 * 0.6666667 + fVar215 * 0.16666667 + auVar203._4_4_;
  auVar247._8_4_ =
       fVar197 * 0.16666667 + fVar199 * 0.6666667 + fVar216 * 0.16666667 + auVar203._8_4_;
  auVar247._12_4_ =
       fVar157 * 0.16666667 + fVar159 * 0.6666667 + fVar217 * 0.16666667 + auVar203._12_4_;
  auVar221._0_4_ = fVar201 * 0.5 + fVar198 * 0.0;
  auVar221._4_4_ = fVar215 * 0.5 + fVar158 * 0.0;
  auVar221._8_4_ = fVar216 * 0.5 + fVar199 * 0.0;
  auVar221._12_4_ = fVar217 * 0.5 + fVar159 * 0.0;
  auVar182._0_4_ = fVar179 * 0.5;
  auVar182._4_4_ = fVar150 * 0.5;
  auVar182._8_4_ = fVar197 * 0.5;
  auVar182._12_4_ = fVar157 * 0.5;
  auVar146 = vsubps_avx(auVar221,auVar182);
  auVar65 = vsubps_avx(auVar146,auVar203);
  auVar146 = vshufps_avx(auVar134,auVar134,0xc9);
  auVar205 = vshufps_avx(auVar272,auVar272,0xc9);
  fVar91 = auVar134._0_4_;
  auVar222._0_4_ = fVar91 * auVar205._0_4_;
  fVar92 = auVar134._4_4_;
  auVar222._4_4_ = fVar92 * auVar205._4_4_;
  fVar93 = auVar134._8_4_;
  auVar222._8_4_ = fVar93 * auVar205._8_4_;
  fVar94 = auVar134._12_4_;
  auVar222._12_4_ = fVar94 * auVar205._12_4_;
  auVar231._0_4_ = auVar272._0_4_ * auVar146._0_4_;
  auVar231._4_4_ = auVar272._4_4_ * auVar146._4_4_;
  auVar231._8_4_ = auVar272._8_4_ * auVar146._8_4_;
  auVar231._12_4_ = auVar272._12_4_ * auVar146._12_4_;
  auVar205 = vsubps_avx(auVar231,auVar222);
  auVar11 = vshufps_avx(auVar205,auVar205,0xc9);
  auVar205 = vshufps_avx(auVar273,auVar273,0xc9);
  auVar223._0_4_ = fVar91 * auVar205._0_4_;
  auVar223._4_4_ = fVar92 * auVar205._4_4_;
  auVar223._8_4_ = fVar93 * auVar205._8_4_;
  auVar223._12_4_ = fVar94 * auVar205._12_4_;
  auVar183._0_4_ = auVar273._0_4_ * auVar146._0_4_;
  auVar183._4_4_ = auVar273._4_4_ * auVar146._4_4_;
  auVar183._8_4_ = auVar273._8_4_ * auVar146._8_4_;
  auVar183._12_4_ = auVar273._12_4_ * auVar146._12_4_;
  auVar146 = vsubps_avx(auVar183,auVar223);
  auVar273 = vshufps_avx(auVar146,auVar146,0xc9);
  auVar205 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar146 = vshufps_avx(auVar247,auVar247,0xc9);
  fVar160 = auVar64._0_4_;
  auVar184._0_4_ = fVar160 * auVar146._0_4_;
  fVar200 = auVar64._4_4_;
  auVar184._4_4_ = fVar200 * auVar146._4_4_;
  fVar178 = auVar64._8_4_;
  auVar184._8_4_ = fVar178 * auVar146._8_4_;
  fVar229 = auVar64._12_4_;
  auVar184._12_4_ = fVar229 * auVar146._12_4_;
  auVar248._0_4_ = auVar247._0_4_ * auVar205._0_4_;
  auVar248._4_4_ = auVar247._4_4_ * auVar205._4_4_;
  auVar248._8_4_ = auVar247._8_4_ * auVar205._8_4_;
  auVar248._12_4_ = auVar247._12_4_ * auVar205._12_4_;
  auVar146 = vsubps_avx(auVar248,auVar184);
  auVar12 = vshufps_avx(auVar146,auVar146,0xc9);
  auVar146 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar249._0_4_ = auVar146._0_4_ * fVar160;
  auVar249._4_4_ = auVar146._4_4_ * fVar200;
  auVar249._8_4_ = auVar146._8_4_ * fVar178;
  auVar249._12_4_ = auVar146._12_4_ * fVar229;
  auVar146 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar204._0_4_ = auVar205._0_4_ * auVar65._0_4_;
  auVar204._4_4_ = auVar205._4_4_ * auVar65._4_4_;
  auVar204._8_4_ = auVar205._8_4_ * auVar65._8_4_;
  auVar204._12_4_ = auVar205._12_4_ * auVar65._12_4_;
  auVar205 = vsubps_avx(auVar204,auVar249);
  auVar65 = vshufps_avx(auVar205,auVar205,0xc9);
  fVar198 = auVar146._0_4_;
  auVar125 = ZEXT416((uint)fVar198);
  auVar205 = vrsqrtss_avx(auVar125,auVar125);
  fVar179 = auVar205._0_4_;
  auVar205 = ZEXT416((uint)(fVar179 * 1.5 - fVar198 * 0.5 * fVar179 * fVar179 * fVar179));
  auVar102 = vshufps_avx(auVar205,auVar205,0);
  auVar205 = vdpps_avx(auVar11,auVar273,0x7f);
  fVar179 = auVar11._0_4_ * auVar102._0_4_;
  fVar150 = auVar11._4_4_ * auVar102._4_4_;
  fVar197 = auVar11._8_4_ * auVar102._8_4_;
  fVar157 = auVar11._12_4_ * auVar102._12_4_;
  auVar146 = vshufps_avx(auVar146,auVar146,0);
  auVar265._0_4_ = auVar273._0_4_ * auVar146._0_4_;
  auVar265._4_4_ = auVar273._4_4_ * auVar146._4_4_;
  auVar265._8_4_ = auVar273._8_4_ * auVar146._8_4_;
  auVar265._12_4_ = auVar273._12_4_ * auVar146._12_4_;
  auVar146 = vshufps_avx(auVar205,auVar205,0);
  auVar232._0_4_ = auVar11._0_4_ * auVar146._0_4_;
  auVar232._4_4_ = auVar11._4_4_ * auVar146._4_4_;
  auVar232._8_4_ = auVar11._8_4_ * auVar146._8_4_;
  auVar232._12_4_ = auVar11._12_4_ * auVar146._12_4_;
  auVar98 = vsubps_avx(auVar265,auVar232);
  auVar146 = vrcpss_avx(auVar125,auVar125);
  auVar146 = ZEXT416((uint)(auVar146._0_4_ * (2.0 - fVar198 * auVar146._0_4_)));
  auVar11 = vshufps_avx(auVar146,auVar146,0);
  auVar146 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar198 = auVar146._0_4_;
  auVar125 = ZEXT416((uint)fVar198);
  auVar205 = vrsqrtss_avx(auVar125,auVar125);
  fVar158 = auVar205._0_4_;
  auVar205 = vdpps_avx(auVar12,auVar65,0x7f);
  auVar273 = ZEXT416((uint)(fVar158 * 1.5 - fVar198 * 0.5 * fVar158 * fVar158 * fVar158));
  auVar273 = vshufps_avx(auVar273,auVar273,0);
  fVar158 = auVar273._0_4_ * auVar12._0_4_;
  fVar199 = auVar273._4_4_ * auVar12._4_4_;
  fVar159 = auVar273._8_4_ * auVar12._8_4_;
  fVar201 = auVar273._12_4_ * auVar12._12_4_;
  auVar146 = vshufps_avx(auVar146,auVar146,0);
  auVar224._0_4_ = auVar146._0_4_ * auVar65._0_4_;
  auVar224._4_4_ = auVar146._4_4_ * auVar65._4_4_;
  auVar224._8_4_ = auVar146._8_4_ * auVar65._8_4_;
  auVar224._12_4_ = auVar146._12_4_ * auVar65._12_4_;
  auVar146 = vshufps_avx(auVar205,auVar205,0);
  auVar185._0_4_ = auVar146._0_4_ * auVar12._0_4_;
  auVar185._4_4_ = auVar146._4_4_ * auVar12._4_4_;
  auVar185._8_4_ = auVar146._8_4_ * auVar12._8_4_;
  auVar185._12_4_ = auVar146._12_4_ * auVar12._12_4_;
  auVar65 = vsubps_avx(auVar224,auVar185);
  auVar146 = vrcpss_avx(auVar125,auVar125);
  auVar146 = ZEXT416((uint)((2.0 - fVar198 * auVar146._0_4_) * auVar146._0_4_));
  auVar146 = vshufps_avx(auVar146,auVar146,0);
  auVar205 = vshufps_avx(_local_680,_local_680,0xff);
  auVar250._0_4_ = auVar205._0_4_ * fVar179;
  auVar250._4_4_ = auVar205._4_4_ * fVar150;
  auVar250._8_4_ = auVar205._8_4_ * fVar197;
  auVar250._12_4_ = auVar205._12_4_ * fVar157;
  _local_4d0 = vsubps_avx(_local_680,auVar250);
  auVar12 = vshufps_avx(auVar134,auVar134,0xff);
  auVar206._0_4_ =
       auVar12._0_4_ * fVar179 + auVar102._0_4_ * auVar98._0_4_ * auVar11._0_4_ * auVar205._0_4_;
  auVar206._4_4_ =
       auVar12._4_4_ * fVar150 + auVar102._4_4_ * auVar98._4_4_ * auVar11._4_4_ * auVar205._4_4_;
  auVar206._8_4_ =
       auVar12._8_4_ * fVar197 + auVar102._8_4_ * auVar98._8_4_ * auVar11._8_4_ * auVar205._8_4_;
  auVar206._12_4_ =
       auVar12._12_4_ * fVar157 +
       auVar102._12_4_ * auVar98._12_4_ * auVar11._12_4_ * auVar205._12_4_;
  auVar12 = vsubps_avx(auVar134,auVar206);
  local_4e0._0_4_ = auVar250._0_4_ + (float)local_680._0_4_;
  local_4e0._4_4_ = auVar250._4_4_ + (float)local_680._4_4_;
  fStack_4d8 = auVar250._8_4_ + fStack_678;
  fStack_4d4 = auVar250._12_4_ + fStack_674;
  auVar205 = vshufps_avx(_local_620,_local_620,0xff);
  auVar129._0_4_ = fVar158 * auVar205._0_4_;
  auVar129._4_4_ = fVar199 * auVar205._4_4_;
  auVar129._8_4_ = fVar159 * auVar205._8_4_;
  auVar129._12_4_ = fVar201 * auVar205._12_4_;
  _local_4f0 = vsubps_avx(_local_620,auVar129);
  auVar11 = vshufps_avx(auVar64,auVar64,0xff);
  auVar99._0_4_ =
       fVar158 * auVar11._0_4_ + auVar205._0_4_ * auVar273._0_4_ * auVar65._0_4_ * auVar146._0_4_;
  auVar99._4_4_ =
       fVar199 * auVar11._4_4_ + auVar205._4_4_ * auVar273._4_4_ * auVar65._4_4_ * auVar146._4_4_;
  auVar99._8_4_ =
       fVar159 * auVar11._8_4_ + auVar205._8_4_ * auVar273._8_4_ * auVar65._8_4_ * auVar146._8_4_;
  auVar99._12_4_ =
       fVar201 * auVar11._12_4_ +
       auVar205._12_4_ * auVar273._12_4_ * auVar65._12_4_ * auVar146._12_4_;
  auVar273 = vsubps_avx(auVar64,auVar99);
  fVar63 = (float)local_620._0_4_ + auVar129._0_4_;
  fVar88 = (float)local_620._4_4_ + auVar129._4_4_;
  fVar89 = fStack_618 + auVar129._8_4_;
  fVar90 = fStack_614 + auVar129._12_4_;
  local_500._0_4_ = local_4d0._0_4_ + auVar12._0_4_ * 0.33333334;
  local_500._4_4_ = local_4d0._4_4_ + auVar12._4_4_ * 0.33333334;
  fStack_4f8 = local_4d0._8_4_ + auVar12._8_4_ * 0.33333334;
  fStack_4f4 = local_4d0._12_4_ + auVar12._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_4d0,auVar144);
  auVar205 = vmovsldup_avx(local_380);
  auVar146 = vmovshdup_avx(local_380);
  auVar11 = vshufps_avx(local_380,local_380,0xaa);
  fVar179 = pre->ray_space[k].vx.field_0.m128[0];
  fVar150 = pre->ray_space[k].vx.field_0.m128[1];
  fVar197 = pre->ray_space[k].vx.field_0.m128[2];
  fVar157 = pre->ray_space[k].vx.field_0.m128[3];
  fVar198 = pre->ray_space[k].vy.field_0.m128[0];
  fVar158 = pre->ray_space[k].vy.field_0.m128[1];
  fVar199 = pre->ray_space[k].vy.field_0.m128[2];
  fVar159 = pre->ray_space[k].vy.field_0.m128[3];
  fVar201 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar216 = pre->ray_space[k].vz.field_0.m128[2];
  fVar217 = pre->ray_space[k].vz.field_0.m128[3];
  fVar95 = fVar179 * auVar205._0_4_ + auVar11._0_4_ * fVar201 + fVar198 * auVar146._0_4_;
  fVar121 = fVar150 * auVar205._4_4_ + auVar11._4_4_ * fVar215 + fVar158 * auVar146._4_4_;
  local_690._4_4_ = fVar121;
  local_690._0_4_ = fVar95;
  fStack_688 = fVar197 * auVar205._8_4_ + auVar11._8_4_ * fVar216 + fVar199 * auVar146._8_4_;
  fStack_684 = fVar157 * auVar205._12_4_ + auVar11._12_4_ * fVar217 + fVar159 * auVar146._12_4_;
  local_390 = vsubps_avx(_local_500,auVar144);
  auVar11 = vshufps_avx(local_390,local_390,0xaa);
  auVar146 = vmovshdup_avx(local_390);
  auVar205 = vmovsldup_avx(local_390);
  fVar96 = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + fVar201 * auVar11._0_4_;
  fVar122 = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + fVar215 * auVar11._4_4_;
  local_620._4_4_ = fVar122;
  local_620._0_4_ = fVar96;
  fStack_618 = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + fVar216 * auVar11._8_4_;
  fStack_614 = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + fVar217 * auVar11._12_4_;
  auVar186._0_4_ = auVar273._0_4_ * 0.33333334;
  auVar186._4_4_ = auVar273._4_4_ * 0.33333334;
  auVar186._8_4_ = auVar273._8_4_ * 0.33333334;
  auVar186._12_4_ = auVar273._12_4_ * 0.33333334;
  _local_510 = vsubps_avx(_local_4f0,auVar186);
  local_3a0 = vsubps_avx(_local_510,auVar144);
  auVar11 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar146 = vmovshdup_avx(local_3a0);
  auVar205 = vmovsldup_avx(local_3a0);
  fVar97 = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + fVar201 * auVar11._0_4_;
  fVar123 = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + fVar215 * auVar11._4_4_;
  local_5f0._4_4_ = fVar123;
  local_5f0._0_4_ = fVar97;
  fStack_5e8 = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + fVar216 * auVar11._8_4_;
  fStack_5e4 = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + fVar217 * auVar11._12_4_;
  local_3b0 = vsubps_avx(_local_4f0,auVar144);
  auVar11 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar146 = vmovshdup_avx(local_3b0);
  auVar205 = vmovsldup_avx(local_3b0);
  auVar294._0_4_ = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + auVar11._0_4_ * fVar201;
  auVar294._4_4_ = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + auVar11._4_4_ * fVar215;
  auVar294._8_4_ = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + auVar11._8_4_ * fVar216;
  auVar294._12_4_ = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + auVar11._12_4_ * fVar217
  ;
  local_3c0 = vsubps_avx(_local_4e0,auVar144);
  auVar11 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar146 = vmovshdup_avx(local_3c0);
  auVar205 = vmovsldup_avx(local_3c0);
  auVar187._0_4_ = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + auVar11._0_4_ * fVar201;
  auVar187._4_4_ = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + auVar11._4_4_ * fVar215;
  auVar187._8_4_ = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + auVar11._8_4_ * fVar216;
  auVar187._12_4_ = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + auVar11._12_4_ * fVar217
  ;
  local_520._0_4_ = (float)local_4e0._0_4_ + (fVar91 + auVar206._0_4_) * 0.33333334;
  local_520._4_4_ = (float)local_4e0._4_4_ + (fVar92 + auVar206._4_4_) * 0.33333334;
  fStack_518 = fStack_4d8 + (fVar93 + auVar206._8_4_) * 0.33333334;
  fStack_514 = fStack_4d4 + (fVar94 + auVar206._12_4_) * 0.33333334;
  local_3d0 = vsubps_avx(_local_520,auVar144);
  auVar11 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar146 = vmovshdup_avx(local_3d0);
  auVar205 = vmovsldup_avx(local_3d0);
  auVar282._0_4_ = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + auVar11._0_4_ * fVar201;
  auVar282._4_4_ = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + auVar11._4_4_ * fVar215;
  auVar282._8_4_ = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + auVar11._8_4_ * fVar216;
  auVar282._12_4_ = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + auVar11._12_4_ * fVar217
  ;
  auVar225._0_4_ = (fVar160 + auVar99._0_4_) * 0.33333334;
  auVar225._4_4_ = (fVar200 + auVar99._4_4_) * 0.33333334;
  auVar225._8_4_ = (fVar178 + auVar99._8_4_) * 0.33333334;
  auVar225._12_4_ = (fVar229 + auVar99._12_4_) * 0.33333334;
  auVar51._4_4_ = fVar88;
  auVar51._0_4_ = fVar63;
  auVar51._8_4_ = fVar89;
  auVar51._12_4_ = fVar90;
  _local_420 = vsubps_avx(auVar51,auVar225);
  local_3e0 = vsubps_avx(_local_420,auVar144);
  auVar11 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar146 = vmovshdup_avx(local_3e0);
  auVar205 = vmovsldup_avx(local_3e0);
  auVar266._0_4_ = auVar205._0_4_ * fVar179 + auVar146._0_4_ * fVar198 + fVar201 * auVar11._0_4_;
  auVar266._4_4_ = auVar205._4_4_ * fVar150 + auVar146._4_4_ * fVar158 + fVar215 * auVar11._4_4_;
  auVar266._8_4_ = auVar205._8_4_ * fVar197 + auVar146._8_4_ * fVar199 + fVar216 * auVar11._8_4_;
  auVar266._12_4_ = auVar205._12_4_ * fVar157 + auVar146._12_4_ * fVar159 + fVar217 * auVar11._12_4_
  ;
  local_3f0 = vsubps_avx(auVar51,auVar144);
  auVar144 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar146 = vmovshdup_avx(local_3f0);
  auVar205 = vmovsldup_avx(local_3f0);
  auVar251._0_4_ = fVar179 * auVar205._0_4_ + fVar198 * auVar146._0_4_ + fVar201 * auVar144._0_4_;
  auVar251._4_4_ = fVar150 * auVar205._4_4_ + fVar158 * auVar146._4_4_ + fVar215 * auVar144._4_4_;
  auVar251._8_4_ = fVar197 * auVar205._8_4_ + fVar199 * auVar146._8_4_ + fVar216 * auVar144._8_4_;
  auVar251._12_4_ =
       fVar157 * auVar205._12_4_ + fVar159 * auVar146._12_4_ + fVar217 * auVar144._12_4_;
  auVar11 = vmovlhps_avx(_local_690,auVar187);
  auVar273 = vmovlhps_avx(_local_620,auVar282);
  auVar12 = vmovlhps_avx(_local_5f0,auVar266);
  _local_4b0 = vmovlhps_avx(auVar294,auVar251);
  auVar146 = vminps_avx(auVar11,auVar273);
  auVar205 = vminps_avx(auVar12,_local_4b0);
  auVar144 = vminps_avx(auVar146,auVar205);
  auVar146 = vmaxps_avx(auVar11,auVar273);
  auVar205 = vmaxps_avx(auVar12,_local_4b0);
  auVar146 = vmaxps_avx(auVar146,auVar205);
  auVar205 = vshufpd_avx(auVar144,auVar144,3);
  auVar144 = vminps_avx(auVar144,auVar205);
  auVar205 = vshufpd_avx(auVar146,auVar146,3);
  auVar205 = vmaxps_avx(auVar146,auVar205);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar146 = vandps_avx(auVar144,auVar207);
  auVar205 = vandps_avx(auVar205,auVar207);
  auVar146 = vmaxps_avx(auVar146,auVar205);
  auVar205 = vmovshdup_avx(auVar146);
  auVar146 = vmaxss_avx(auVar205,auVar146);
  fVar179 = auVar146._0_4_ * 9.536743e-07;
  local_4c0 = ZEXT416((uint)fVar179);
  auVar146 = vshufps_avx(local_4c0,ZEXT416((uint)fVar179),0);
  local_1c0._16_16_ = auVar146;
  local_1c0._0_16_ = auVar146;
  auVar66._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
  auVar66._8_4_ = auVar146._8_4_ ^ 0x80000000;
  auVar66._12_4_ = auVar146._12_4_ ^ 0x80000000;
  local_340._16_16_ = auVar66;
  local_340._0_16_ = auVar66;
  auVar146 = vpshufd_avx(ZEXT416(uVar53),0);
  local_2e0._16_16_ = auVar146;
  local_2e0._0_16_ = auVar146;
  auVar146 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar56 * 4 + 6)),0);
  local_300._16_16_ = auVar146;
  local_300._0_16_ = auVar146;
  bVar62 = false;
  uVar61 = 0;
  fVar179 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar273,auVar11);
  _local_360 = vsubps_avx(auVar12,auVar273);
  _local_370 = vsubps_avx(_local_4b0,auVar12);
  _local_430 = vsubps_avx(_local_4e0,_local_4d0);
  _local_440 = vsubps_avx(_local_520,_local_500);
  _local_450 = vsubps_avx(_local_420,_local_510);
  auVar52._4_4_ = fVar88;
  auVar52._0_4_ = fVar63;
  auVar52._8_4_ = fVar89;
  auVar52._12_4_ = fVar90;
  _local_460 = vsubps_avx(auVar52,_local_4f0);
  auVar214 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar297 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e3fac0:
  do {
    local_400 = auVar297._0_16_;
    auVar126 = auVar214._0_16_;
    auVar146 = vshufps_avx(auVar126,auVar126,0x50);
    auVar300._8_4_ = 0x3f800000;
    auVar300._0_8_ = 0x3f8000003f800000;
    auVar300._12_4_ = 0x3f800000;
    auVar303._16_4_ = 0x3f800000;
    auVar303._0_16_ = auVar300;
    auVar303._20_4_ = 0x3f800000;
    auVar303._24_4_ = 0x3f800000;
    auVar303._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar300,auVar146);
    fVar150 = auVar146._0_4_;
    fVar157 = auVar146._4_4_;
    fVar158 = auVar146._8_4_;
    fVar159 = auVar146._12_4_;
    fVar197 = auVar205._0_4_;
    fVar198 = auVar205._4_4_;
    fVar199 = auVar205._8_4_;
    fVar201 = auVar205._12_4_;
    auVar153._0_4_ = auVar187._0_4_ * fVar150 + fVar95 * fVar197;
    auVar153._4_4_ = auVar187._4_4_ * fVar157 + fVar121 * fVar198;
    auVar153._8_4_ = auVar187._0_4_ * fVar158 + fVar95 * fVar199;
    auVar153._12_4_ = auVar187._4_4_ * fVar159 + fVar121 * fVar201;
    auVar130._0_4_ = auVar282._0_4_ * fVar150 + fVar96 * fVar197;
    auVar130._4_4_ = auVar282._4_4_ * fVar157 + fVar122 * fVar198;
    auVar130._8_4_ = auVar282._0_4_ * fVar158 + fVar96 * fVar199;
    auVar130._12_4_ = auVar282._4_4_ * fVar159 + fVar122 * fVar201;
    auVar226._0_4_ = auVar266._0_4_ * fVar150 + fVar97 * fVar197;
    auVar226._4_4_ = auVar266._4_4_ * fVar157 + fVar123 * fVar198;
    auVar226._8_4_ = auVar266._0_4_ * fVar158 + fVar97 * fVar199;
    auVar226._12_4_ = auVar266._4_4_ * fVar159 + fVar123 * fVar201;
    auVar164._0_4_ = auVar251._0_4_ * fVar150 + auVar294._0_4_ * fVar197;
    auVar164._4_4_ = auVar251._4_4_ * fVar157 + auVar294._4_4_ * fVar198;
    auVar164._8_4_ = auVar251._0_4_ * fVar158 + auVar294._0_4_ * fVar199;
    auVar164._12_4_ = auVar251._4_4_ * fVar159 + auVar294._4_4_ * fVar201;
    auVar146 = vmovshdup_avx(local_400);
    auVar205 = vshufps_avx(local_400,local_400,0);
    auVar257._16_16_ = auVar205;
    auVar257._0_16_ = auVar205;
    auVar144 = vshufps_avx(local_400,local_400,0x55);
    auVar82._16_16_ = auVar144;
    auVar82._0_16_ = auVar144;
    auVar81 = vsubps_avx(auVar82,auVar257);
    auVar144 = vshufps_avx(auVar153,auVar153,0);
    auVar65 = vshufps_avx(auVar153,auVar153,0x55);
    auVar102 = vshufps_avx(auVar130,auVar130,0);
    auVar134 = vshufps_avx(auVar130,auVar130,0x55);
    auVar64 = vshufps_avx(auVar226,auVar226,0);
    auVar98 = vshufps_avx(auVar226,auVar226,0x55);
    auVar125 = vshufps_avx(auVar164,auVar164,0);
    auVar124 = vshufps_avx(auVar164,auVar164,0x55);
    auVar146 = ZEXT416((uint)((auVar146._0_4_ - auVar297._0_4_) * 0.04761905));
    auVar146 = vshufps_avx(auVar146,auVar146,0);
    auVar269._0_4_ = auVar205._0_4_ + auVar81._0_4_ * 0.0;
    auVar269._4_4_ = auVar205._4_4_ + auVar81._4_4_ * 0.14285715;
    auVar269._8_4_ = auVar205._8_4_ + auVar81._8_4_ * 0.2857143;
    auVar269._12_4_ = auVar205._12_4_ + auVar81._12_4_ * 0.42857146;
    auVar269._16_4_ = auVar205._0_4_ + auVar81._16_4_ * 0.5714286;
    auVar269._20_4_ = auVar205._4_4_ + auVar81._20_4_ * 0.71428573;
    auVar269._24_4_ = auVar205._8_4_ + auVar81._24_4_ * 0.8571429;
    auVar269._28_4_ = auVar205._12_4_ + auVar81._28_4_;
    auVar13 = vsubps_avx(auVar303,auVar269);
    fVar150 = auVar102._0_4_;
    fVar157 = auVar102._4_4_;
    fVar158 = auVar102._8_4_;
    fVar159 = auVar102._12_4_;
    fVar244 = auVar13._0_4_;
    fVar259 = auVar13._4_4_;
    fVar260 = auVar13._8_4_;
    fVar261 = auVar13._12_4_;
    fVar262 = auVar13._16_4_;
    fVar263 = auVar13._20_4_;
    fVar264 = auVar13._24_4_;
    fVar240 = auVar134._0_4_;
    fVar241 = auVar134._4_4_;
    fVar242 = auVar134._8_4_;
    fVar243 = auVar134._12_4_;
    fVar298 = auVar65._12_4_ + 1.0;
    fVar200 = auVar64._0_4_;
    fVar178 = auVar64._4_4_;
    fVar229 = auVar64._8_4_;
    fVar239 = auVar64._12_4_;
    fVar215 = fVar200 * auVar269._0_4_ + fVar244 * fVar150;
    fVar216 = fVar178 * auVar269._4_4_ + fVar259 * fVar157;
    fVar217 = fVar229 * auVar269._8_4_ + fVar260 * fVar158;
    fVar91 = fVar239 * auVar269._12_4_ + fVar261 * fVar159;
    fVar92 = fVar200 * auVar269._16_4_ + fVar262 * fVar150;
    fVar93 = fVar178 * auVar269._20_4_ + fVar263 * fVar157;
    fVar94 = fVar229 * auVar269._24_4_ + fVar264 * fVar158;
    fVar197 = auVar98._0_4_;
    fVar198 = auVar98._4_4_;
    fVar199 = auVar98._8_4_;
    fVar201 = auVar98._12_4_;
    fVar279 = fVar240 * fVar244 + auVar269._0_4_ * fVar197;
    fVar284 = fVar241 * fVar259 + auVar269._4_4_ * fVar198;
    fVar285 = fVar242 * fVar260 + auVar269._8_4_ * fVar199;
    fVar286 = fVar243 * fVar261 + auVar269._12_4_ * fVar201;
    fVar287 = fVar240 * fVar262 + auVar269._16_4_ * fVar197;
    fVar288 = fVar241 * fVar263 + auVar269._20_4_ * fVar198;
    fVar289 = fVar242 * fVar264 + auVar269._24_4_ * fVar199;
    fVar290 = fVar243 + fVar159;
    auVar205 = vshufps_avx(auVar153,auVar153,0xaa);
    auVar102 = vshufps_avx(auVar153,auVar153,0xff);
    fVar160 = fVar239 + 0.0;
    auVar134 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar64 = vshufps_avx(auVar130,auVar130,0xff);
    auVar176._0_4_ =
         fVar244 * (auVar269._0_4_ * fVar150 + fVar244 * auVar144._0_4_) + auVar269._0_4_ * fVar215;
    auVar176._4_4_ =
         fVar259 * (auVar269._4_4_ * fVar157 + fVar259 * auVar144._4_4_) + auVar269._4_4_ * fVar216;
    auVar176._8_4_ =
         fVar260 * (auVar269._8_4_ * fVar158 + fVar260 * auVar144._8_4_) + auVar269._8_4_ * fVar217;
    auVar176._12_4_ =
         fVar261 * (auVar269._12_4_ * fVar159 + fVar261 * auVar144._12_4_) +
         auVar269._12_4_ * fVar91;
    auVar176._16_4_ =
         fVar262 * (auVar269._16_4_ * fVar150 + fVar262 * auVar144._0_4_) + auVar269._16_4_ * fVar92
    ;
    auVar176._20_4_ =
         fVar263 * (auVar269._20_4_ * fVar157 + fVar263 * auVar144._4_4_) + auVar269._20_4_ * fVar93
    ;
    auVar176._24_4_ =
         fVar264 * (auVar269._24_4_ * fVar158 + fVar264 * auVar144._8_4_) + auVar269._24_4_ * fVar94
    ;
    auVar176._28_4_ = auVar144._12_4_ + 1.0 + fVar201;
    auVar195._0_4_ =
         fVar244 * (fVar240 * auVar269._0_4_ + auVar65._0_4_ * fVar244) + auVar269._0_4_ * fVar279;
    auVar195._4_4_ =
         fVar259 * (fVar241 * auVar269._4_4_ + auVar65._4_4_ * fVar259) + auVar269._4_4_ * fVar284;
    auVar195._8_4_ =
         fVar260 * (fVar242 * auVar269._8_4_ + auVar65._8_4_ * fVar260) + auVar269._8_4_ * fVar285;
    auVar195._12_4_ =
         fVar261 * (fVar243 * auVar269._12_4_ + auVar65._12_4_ * fVar261) +
         auVar269._12_4_ * fVar286;
    auVar195._16_4_ =
         fVar262 * (fVar240 * auVar269._16_4_ + auVar65._0_4_ * fVar262) + auVar269._16_4_ * fVar287
    ;
    auVar195._20_4_ =
         fVar263 * (fVar241 * auVar269._20_4_ + auVar65._4_4_ * fVar263) + auVar269._20_4_ * fVar288
    ;
    auVar195._24_4_ =
         fVar264 * (fVar242 * auVar269._24_4_ + auVar65._8_4_ * fVar264) + auVar269._24_4_ * fVar289
    ;
    auVar195._28_4_ = auVar124._12_4_ + fVar201;
    auVar83._0_4_ =
         fVar244 * fVar215 + auVar269._0_4_ * (fVar200 * fVar244 + auVar125._0_4_ * auVar269._0_4_);
    auVar83._4_4_ =
         fVar259 * fVar216 + auVar269._4_4_ * (fVar178 * fVar259 + auVar125._4_4_ * auVar269._4_4_);
    auVar83._8_4_ =
         fVar260 * fVar217 + auVar269._8_4_ * (fVar229 * fVar260 + auVar125._8_4_ * auVar269._8_4_);
    auVar83._12_4_ =
         fVar261 * fVar91 +
         auVar269._12_4_ * (fVar239 * fVar261 + auVar125._12_4_ * auVar269._12_4_);
    auVar83._16_4_ =
         fVar262 * fVar92 + auVar269._16_4_ * (fVar200 * fVar262 + auVar125._0_4_ * auVar269._16_4_)
    ;
    auVar83._20_4_ =
         fVar263 * fVar93 + auVar269._20_4_ * (fVar178 * fVar263 + auVar125._4_4_ * auVar269._20_4_)
    ;
    auVar83._24_4_ =
         fVar264 * fVar94 + auVar269._24_4_ * (fVar229 * fVar264 + auVar125._8_4_ * auVar269._24_4_)
    ;
    auVar83._28_4_ = fVar159 + 1.0 + fVar160;
    auVar278._0_4_ =
         fVar244 * fVar279 + auVar269._0_4_ * (auVar124._0_4_ * auVar269._0_4_ + fVar244 * fVar197);
    auVar278._4_4_ =
         fVar259 * fVar284 + auVar269._4_4_ * (auVar124._4_4_ * auVar269._4_4_ + fVar259 * fVar198);
    auVar278._8_4_ =
         fVar260 * fVar285 + auVar269._8_4_ * (auVar124._8_4_ * auVar269._8_4_ + fVar260 * fVar199);
    auVar278._12_4_ =
         fVar261 * fVar286 +
         auVar269._12_4_ * (auVar124._12_4_ * auVar269._12_4_ + fVar261 * fVar201);
    auVar278._16_4_ =
         fVar262 * fVar287 +
         auVar269._16_4_ * (auVar124._0_4_ * auVar269._16_4_ + fVar262 * fVar197);
    auVar278._20_4_ =
         fVar263 * fVar288 +
         auVar269._20_4_ * (auVar124._4_4_ * auVar269._20_4_ + fVar263 * fVar198);
    auVar278._24_4_ =
         fVar264 * fVar289 +
         auVar269._24_4_ * (auVar124._8_4_ * auVar269._24_4_ + fVar264 * fVar199);
    auVar278._28_4_ = fVar160 + fVar201 + 0.0;
    local_200._0_4_ = fVar244 * auVar176._0_4_ + auVar269._0_4_ * auVar83._0_4_;
    local_200._4_4_ = fVar259 * auVar176._4_4_ + auVar269._4_4_ * auVar83._4_4_;
    local_200._8_4_ = fVar260 * auVar176._8_4_ + auVar269._8_4_ * auVar83._8_4_;
    local_200._12_4_ = fVar261 * auVar176._12_4_ + auVar269._12_4_ * auVar83._12_4_;
    local_200._16_4_ = fVar262 * auVar176._16_4_ + auVar269._16_4_ * auVar83._16_4_;
    local_200._20_4_ = fVar263 * auVar176._20_4_ + auVar269._20_4_ * auVar83._20_4_;
    local_200._24_4_ = fVar264 * auVar176._24_4_ + auVar269._24_4_ * auVar83._24_4_;
    local_200._28_4_ = fVar290 + fVar201 + 0.0;
    auVar156._0_4_ = fVar244 * auVar195._0_4_ + auVar269._0_4_ * auVar278._0_4_;
    auVar156._4_4_ = fVar259 * auVar195._4_4_ + auVar269._4_4_ * auVar278._4_4_;
    auVar156._8_4_ = fVar260 * auVar195._8_4_ + auVar269._8_4_ * auVar278._8_4_;
    auVar156._12_4_ = fVar261 * auVar195._12_4_ + auVar269._12_4_ * auVar278._12_4_;
    auVar156._16_4_ = fVar262 * auVar195._16_4_ + auVar269._16_4_ * auVar278._16_4_;
    auVar156._20_4_ = fVar263 * auVar195._20_4_ + auVar269._20_4_ * auVar278._20_4_;
    auVar156._24_4_ = fVar264 * auVar195._24_4_ + auVar269._24_4_ * auVar278._24_4_;
    auVar156._28_4_ = fVar290 + fVar160;
    auVar14 = vsubps_avx(auVar83,auVar176);
    auVar81 = vsubps_avx(auVar278,auVar195);
    local_5c0 = auVar146._0_4_;
    fStack_5bc = auVar146._4_4_;
    fStack_5b8 = auVar146._8_4_;
    fStack_5b4 = auVar146._12_4_;
    local_240 = local_5c0 * auVar14._0_4_ * 3.0;
    fStack_23c = fStack_5bc * auVar14._4_4_ * 3.0;
    auVar15._4_4_ = fStack_23c;
    auVar15._0_4_ = local_240;
    fStack_238 = fStack_5b8 * auVar14._8_4_ * 3.0;
    auVar15._8_4_ = fStack_238;
    fStack_234 = fStack_5b4 * auVar14._12_4_ * 3.0;
    auVar15._12_4_ = fStack_234;
    fStack_230 = local_5c0 * auVar14._16_4_ * 3.0;
    auVar15._16_4_ = fStack_230;
    fStack_22c = fStack_5bc * auVar14._20_4_ * 3.0;
    auVar15._20_4_ = fStack_22c;
    fStack_228 = fStack_5b8 * auVar14._24_4_ * 3.0;
    auVar15._24_4_ = fStack_228;
    auVar15._28_4_ = auVar14._28_4_;
    local_260 = local_5c0 * auVar81._0_4_ * 3.0;
    fStack_25c = fStack_5bc * auVar81._4_4_ * 3.0;
    auVar16._4_4_ = fStack_25c;
    auVar16._0_4_ = local_260;
    fStack_258 = fStack_5b8 * auVar81._8_4_ * 3.0;
    auVar16._8_4_ = fStack_258;
    fStack_254 = fStack_5b4 * auVar81._12_4_ * 3.0;
    auVar16._12_4_ = fStack_254;
    fStack_250 = local_5c0 * auVar81._16_4_ * 3.0;
    auVar16._16_4_ = fStack_250;
    fStack_24c = fStack_5bc * auVar81._20_4_ * 3.0;
    auVar16._20_4_ = fStack_24c;
    fStack_248 = fStack_5b8 * auVar81._24_4_ * 3.0;
    auVar16._24_4_ = fStack_248;
    auVar16._28_4_ = fVar290;
    auVar15 = vsubps_avx(local_200,auVar15);
    auVar81 = vperm2f128_avx(auVar15,auVar15,1);
    auVar81 = vshufps_avx(auVar81,auVar15,0x30);
    auVar81 = vshufps_avx(auVar15,auVar81,0x29);
    auVar16 = vsubps_avx(auVar156,auVar16);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar16 = vshufps_avx(auVar16,auVar15,0x29);
    fVar288 = auVar134._0_4_;
    fVar289 = auVar134._4_4_;
    fVar304 = auVar134._8_4_;
    fVar159 = auVar205._12_4_;
    fVar178 = auVar64._0_4_;
    fVar239 = auVar64._4_4_;
    fVar279 = auVar64._8_4_;
    fVar284 = auVar64._12_4_;
    auVar146 = vshufps_avx(auVar226,auVar226,0xaa);
    fVar150 = auVar146._0_4_;
    fVar157 = auVar146._4_4_;
    fVar158 = auVar146._8_4_;
    fVar201 = auVar146._12_4_;
    fVar217 = auVar269._0_4_ * fVar150 + fVar288 * fVar244;
    fVar91 = auVar269._4_4_ * fVar157 + fVar289 * fVar259;
    fVar92 = auVar269._8_4_ * fVar158 + fVar304 * fVar260;
    fVar93 = auVar269._12_4_ * fVar201 + auVar134._12_4_ * fVar261;
    fVar94 = auVar269._16_4_ * fVar150 + fVar288 * fVar262;
    fVar160 = auVar269._20_4_ * fVar157 + fVar289 * fVar263;
    fVar200 = auVar269._24_4_ * fVar158 + fVar304 * fVar264;
    auVar146 = vshufps_avx(auVar226,auVar226,0xff);
    fVar197 = auVar146._0_4_;
    fVar198 = auVar146._4_4_;
    fVar199 = auVar146._8_4_;
    fVar215 = auVar146._12_4_;
    fVar229 = auVar269._0_4_ * fVar197 + fVar178 * fVar244;
    fVar240 = auVar269._4_4_ * fVar198 + fVar239 * fVar259;
    fVar241 = auVar269._8_4_ * fVar199 + fVar279 * fVar260;
    fVar242 = auVar269._12_4_ * fVar215 + fVar284 * fVar261;
    fVar285 = auVar269._16_4_ * fVar197 + fVar178 * fVar262;
    fVar243 = auVar269._20_4_ * fVar198 + fVar239 * fVar263;
    fVar286 = auVar269._24_4_ * fVar199 + fVar279 * fVar264;
    auVar146 = vshufps_avx(auVar164,auVar164,0xaa);
    fVar287 = auVar146._12_4_ + fVar201;
    auVar144 = vshufps_avx(auVar164,auVar164,0xff);
    fVar216 = auVar144._12_4_;
    auVar84._0_4_ =
         fVar244 * (fVar288 * auVar269._0_4_ + fVar244 * auVar205._0_4_) + auVar269._0_4_ * fVar217;
    auVar84._4_4_ =
         fVar259 * (fVar289 * auVar269._4_4_ + fVar259 * auVar205._4_4_) + auVar269._4_4_ * fVar91;
    auVar84._8_4_ =
         fVar260 * (fVar304 * auVar269._8_4_ + fVar260 * auVar205._8_4_) + auVar269._8_4_ * fVar92;
    auVar84._12_4_ =
         fVar261 * (auVar134._12_4_ * auVar269._12_4_ + fVar261 * fVar159) +
         auVar269._12_4_ * fVar93;
    auVar84._16_4_ =
         fVar262 * (fVar288 * auVar269._16_4_ + fVar262 * auVar205._0_4_) + auVar269._16_4_ * fVar94
    ;
    auVar84._20_4_ =
         fVar263 * (fVar289 * auVar269._20_4_ + fVar263 * auVar205._4_4_) +
         auVar269._20_4_ * fVar160;
    auVar84._24_4_ =
         fVar264 * (fVar304 * auVar269._24_4_ + fVar264 * auVar205._8_4_) +
         auVar269._24_4_ * fVar200;
    auVar84._28_4_ = auVar16._28_4_ + fVar159 + fVar216;
    auVar116._0_4_ =
         fVar244 * (fVar178 * auVar269._0_4_ + auVar102._0_4_ * fVar244) + auVar269._0_4_ * fVar229;
    auVar116._4_4_ =
         fVar259 * (fVar239 * auVar269._4_4_ + auVar102._4_4_ * fVar259) + auVar269._4_4_ * fVar240;
    auVar116._8_4_ =
         fVar260 * (fVar279 * auVar269._8_4_ + auVar102._8_4_ * fVar260) + auVar269._8_4_ * fVar241;
    auVar116._12_4_ =
         fVar261 * (fVar284 * auVar269._12_4_ + auVar102._12_4_ * fVar261) +
         auVar269._12_4_ * fVar242;
    auVar116._16_4_ =
         fVar262 * (fVar178 * auVar269._16_4_ + auVar102._0_4_ * fVar262) +
         auVar269._16_4_ * fVar285;
    auVar116._20_4_ =
         fVar263 * (fVar239 * auVar269._20_4_ + auVar102._4_4_ * fVar263) +
         auVar269._20_4_ * fVar243;
    auVar116._24_4_ =
         fVar264 * (fVar279 * auVar269._24_4_ + auVar102._8_4_ * fVar264) +
         auVar269._24_4_ * fVar286;
    auVar116._28_4_ = fVar159 + auVar15._28_4_ + fVar216;
    auVar15 = vperm2f128_avx(local_200,local_200,1);
    auVar15 = vshufps_avx(auVar15,local_200,0x30);
    _local_540 = vshufps_avx(local_200,auVar15,0x29);
    auVar196._0_4_ =
         auVar269._0_4_ * (auVar146._0_4_ * auVar269._0_4_ + fVar244 * fVar150) + fVar244 * fVar217;
    auVar196._4_4_ =
         auVar269._4_4_ * (auVar146._4_4_ * auVar269._4_4_ + fVar259 * fVar157) + fVar259 * fVar91;
    auVar196._8_4_ =
         auVar269._8_4_ * (auVar146._8_4_ * auVar269._8_4_ + fVar260 * fVar158) + fVar260 * fVar92;
    auVar196._12_4_ =
         auVar269._12_4_ * (auVar146._12_4_ * auVar269._12_4_ + fVar261 * fVar201) +
         fVar261 * fVar93;
    auVar196._16_4_ =
         auVar269._16_4_ * (auVar146._0_4_ * auVar269._16_4_ + fVar262 * fVar150) + fVar262 * fVar94
    ;
    auVar196._20_4_ =
         auVar269._20_4_ * (auVar146._4_4_ * auVar269._20_4_ + fVar263 * fVar157) +
         fVar263 * fVar160;
    auVar196._24_4_ =
         auVar269._24_4_ * (auVar146._8_4_ * auVar269._24_4_ + fVar264 * fVar158) +
         fVar264 * fVar200;
    auVar196._28_4_ = fVar287 + fVar298 + auVar195._28_4_;
    auVar238._0_4_ =
         fVar244 * fVar229 + auVar269._0_4_ * (auVar269._0_4_ * auVar144._0_4_ + fVar244 * fVar197);
    auVar238._4_4_ =
         fVar259 * fVar240 + auVar269._4_4_ * (auVar269._4_4_ * auVar144._4_4_ + fVar259 * fVar198);
    auVar238._8_4_ =
         fVar260 * fVar241 + auVar269._8_4_ * (auVar269._8_4_ * auVar144._8_4_ + fVar260 * fVar199);
    auVar238._12_4_ =
         fVar261 * fVar242 + auVar269._12_4_ * (auVar269._12_4_ * fVar216 + fVar261 * fVar215);
    auVar238._16_4_ =
         fVar262 * fVar285 +
         auVar269._16_4_ * (auVar269._16_4_ * auVar144._0_4_ + fVar262 * fVar197);
    auVar238._20_4_ =
         fVar263 * fVar243 +
         auVar269._20_4_ * (auVar269._20_4_ * auVar144._4_4_ + fVar263 * fVar198);
    auVar238._24_4_ =
         fVar264 * fVar286 +
         auVar269._24_4_ * (auVar269._24_4_ * auVar144._8_4_ + fVar264 * fVar199);
    auVar238._28_4_ = fVar298 + fVar284 + fVar216 + fVar215;
    auVar228._0_4_ = fVar244 * auVar84._0_4_ + auVar269._0_4_ * auVar196._0_4_;
    auVar228._4_4_ = fVar259 * auVar84._4_4_ + auVar269._4_4_ * auVar196._4_4_;
    auVar228._8_4_ = fVar260 * auVar84._8_4_ + auVar269._8_4_ * auVar196._8_4_;
    auVar228._12_4_ = fVar261 * auVar84._12_4_ + auVar269._12_4_ * auVar196._12_4_;
    auVar228._16_4_ = fVar262 * auVar84._16_4_ + auVar269._16_4_ * auVar196._16_4_;
    auVar228._20_4_ = fVar263 * auVar84._20_4_ + auVar269._20_4_ * auVar196._20_4_;
    auVar228._24_4_ = fVar264 * auVar84._24_4_ + auVar269._24_4_ * auVar196._24_4_;
    auVar228._28_4_ = fVar287 + fVar216 + fVar215;
    auVar258._0_4_ = fVar244 * auVar116._0_4_ + auVar269._0_4_ * auVar238._0_4_;
    auVar258._4_4_ = fVar259 * auVar116._4_4_ + auVar269._4_4_ * auVar238._4_4_;
    auVar258._8_4_ = fVar260 * auVar116._8_4_ + auVar269._8_4_ * auVar238._8_4_;
    auVar258._12_4_ = fVar261 * auVar116._12_4_ + auVar269._12_4_ * auVar238._12_4_;
    auVar258._16_4_ = fVar262 * auVar116._16_4_ + auVar269._16_4_ * auVar238._16_4_;
    auVar258._20_4_ = fVar263 * auVar116._20_4_ + auVar269._20_4_ * auVar238._20_4_;
    auVar258._24_4_ = fVar264 * auVar116._24_4_ + auVar269._24_4_ * auVar238._24_4_;
    auVar258._28_4_ = auVar13._28_4_ + auVar269._28_4_;
    auVar17 = vsubps_avx(auVar196,auVar84);
    auVar15 = vsubps_avx(auVar238,auVar116);
    local_280 = local_5c0 * auVar17._0_4_ * 3.0;
    fStack_27c = fStack_5bc * auVar17._4_4_ * 3.0;
    auVar13._4_4_ = fStack_27c;
    auVar13._0_4_ = local_280;
    fStack_278 = fStack_5b8 * auVar17._8_4_ * 3.0;
    auVar13._8_4_ = fStack_278;
    fStack_274 = fStack_5b4 * auVar17._12_4_ * 3.0;
    auVar13._12_4_ = fStack_274;
    fStack_270 = local_5c0 * auVar17._16_4_ * 3.0;
    auVar13._16_4_ = fStack_270;
    fStack_26c = fStack_5bc * auVar17._20_4_ * 3.0;
    auVar13._20_4_ = fStack_26c;
    fStack_268 = fStack_5b8 * auVar17._24_4_ * 3.0;
    auVar13._24_4_ = fStack_268;
    auVar13._28_4_ = auVar17._28_4_;
    local_2a0 = local_5c0 * auVar15._0_4_ * 3.0;
    fStack_29c = fStack_5bc * auVar15._4_4_ * 3.0;
    auVar18._4_4_ = fStack_29c;
    auVar18._0_4_ = local_2a0;
    fStack_298 = fStack_5b8 * auVar15._8_4_ * 3.0;
    auVar18._8_4_ = fStack_298;
    fStack_294 = fStack_5b4 * auVar15._12_4_ * 3.0;
    auVar18._12_4_ = fStack_294;
    fStack_290 = local_5c0 * auVar15._16_4_ * 3.0;
    auVar18._16_4_ = fStack_290;
    fStack_28c = fStack_5bc * auVar15._20_4_ * 3.0;
    auVar18._20_4_ = fStack_28c;
    fStack_288 = fStack_5b8 * auVar15._24_4_ * 3.0;
    auVar18._24_4_ = fStack_288;
    auVar18._28_4_ = auVar196._28_4_;
    auVar15 = vperm2f128_avx(auVar228,auVar228,1);
    auVar15 = vshufps_avx(auVar15,auVar228,0x30);
    auVar82 = vshufps_avx(auVar228,auVar15,0x29);
    auVar13 = vsubps_avx(auVar228,auVar13);
    auVar15 = vperm2f128_avx(auVar13,auVar13,1);
    auVar15 = vshufps_avx(auVar15,auVar13,0x30);
    auVar15 = vshufps_avx(auVar13,auVar15,0x29);
    auVar18 = vsubps_avx(auVar258,auVar18);
    auVar13 = vperm2f128_avx(auVar18,auVar18,1);
    auVar13 = vshufps_avx(auVar13,auVar18,0x30);
    auVar18 = vshufps_avx(auVar18,auVar13,0x29);
    auVar19 = vsubps_avx(auVar228,local_200);
    auVar83 = vsubps_avx(auVar82,_local_540);
    fVar150 = auVar83._0_4_ + auVar19._0_4_;
    fVar197 = auVar83._4_4_ + auVar19._4_4_;
    fVar157 = auVar83._8_4_ + auVar19._8_4_;
    fVar198 = auVar83._12_4_ + auVar19._12_4_;
    fVar158 = auVar83._16_4_ + auVar19._16_4_;
    fVar199 = auVar83._20_4_ + auVar19._20_4_;
    fVar159 = auVar83._24_4_ + auVar19._24_4_;
    auVar13 = vperm2f128_avx(auVar156,auVar156,1);
    auVar13 = vshufps_avx(auVar13,auVar156,0x30);
    local_220 = vshufps_avx(auVar156,auVar13,0x29);
    auVar13 = vperm2f128_avx(auVar258,auVar258,1);
    auVar13 = vshufps_avx(auVar13,auVar258,0x30);
    local_1e0 = vshufps_avx(auVar258,auVar13,0x29);
    auVar13 = vsubps_avx(auVar258,auVar156);
    auVar84 = vsubps_avx(local_1e0,local_220);
    fVar201 = auVar84._0_4_ + auVar13._0_4_;
    fVar215 = auVar84._4_4_ + auVar13._4_4_;
    fVar216 = auVar84._8_4_ + auVar13._8_4_;
    fVar217 = auVar84._12_4_ + auVar13._12_4_;
    fVar91 = auVar84._16_4_ + auVar13._16_4_;
    fVar92 = auVar84._20_4_ + auVar13._20_4_;
    fVar93 = auVar84._24_4_ + auVar13._24_4_;
    auVar20._4_4_ = fVar197 * auVar156._4_4_;
    auVar20._0_4_ = fVar150 * auVar156._0_4_;
    auVar20._8_4_ = fVar157 * auVar156._8_4_;
    auVar20._12_4_ = fVar198 * auVar156._12_4_;
    auVar20._16_4_ = fVar158 * auVar156._16_4_;
    auVar20._20_4_ = fVar199 * auVar156._20_4_;
    auVar20._24_4_ = fVar159 * auVar156._24_4_;
    auVar20._28_4_ = auVar13._28_4_;
    auVar21._4_4_ = fVar215 * local_200._4_4_;
    auVar21._0_4_ = fVar201 * local_200._0_4_;
    auVar21._8_4_ = fVar216 * local_200._8_4_;
    auVar21._12_4_ = fVar217 * local_200._12_4_;
    auVar21._16_4_ = fVar91 * local_200._16_4_;
    auVar21._20_4_ = fVar92 * local_200._20_4_;
    auVar21._24_4_ = fVar93 * local_200._24_4_;
    auVar21._28_4_ = fVar287;
    auVar20 = vsubps_avx(auVar20,auVar21);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar14._28_4_;
    local_260 = local_260 + auVar156._0_4_;
    fStack_25c = fStack_25c + auVar156._4_4_;
    fStack_258 = fStack_258 + auVar156._8_4_;
    fStack_254 = fStack_254 + auVar156._12_4_;
    fStack_250 = fStack_250 + auVar156._16_4_;
    fStack_24c = fStack_24c + auVar156._20_4_;
    fStack_248 = fStack_248 + auVar156._24_4_;
    fStack_244 = fVar290 + auVar156._28_4_;
    auVar14._4_4_ = fVar197 * fStack_25c;
    auVar14._0_4_ = fVar150 * local_260;
    auVar14._8_4_ = fVar157 * fStack_258;
    auVar14._12_4_ = fVar198 * fStack_254;
    auVar14._16_4_ = fVar158 * fStack_250;
    auVar14._20_4_ = fVar199 * fStack_24c;
    auVar14._24_4_ = fVar159 * fStack_248;
    auVar14._28_4_ = fVar290;
    auVar22._4_4_ = fVar215 * fStack_23c;
    auVar22._0_4_ = fVar201 * local_240;
    auVar22._8_4_ = fVar216 * fStack_238;
    auVar22._12_4_ = fVar217 * fStack_234;
    auVar22._16_4_ = fVar91 * fStack_230;
    auVar22._20_4_ = fVar92 * fStack_22c;
    auVar22._24_4_ = fVar93 * fStack_228;
    auVar22._28_4_ = fVar290 + auVar156._28_4_;
    auVar14 = vsubps_avx(auVar14,auVar22);
    local_620._0_4_ = auVar16._0_4_;
    local_620._4_4_ = auVar16._4_4_;
    fStack_618 = auVar16._8_4_;
    fStack_614 = auVar16._12_4_;
    fStack_610 = auVar16._16_4_;
    fStack_60c = auVar16._20_4_;
    fStack_608 = auVar16._24_4_;
    auVar23._4_4_ = fVar197 * (float)local_620._4_4_;
    auVar23._0_4_ = fVar150 * (float)local_620._0_4_;
    auVar23._8_4_ = fVar157 * fStack_618;
    auVar23._12_4_ = fVar198 * fStack_614;
    auVar23._16_4_ = fVar158 * fStack_610;
    auVar23._20_4_ = fVar199 * fStack_60c;
    auVar23._24_4_ = fVar159 * fStack_608;
    auVar23._28_4_ = fVar290;
    local_680._0_4_ = auVar81._0_4_;
    local_680._4_4_ = auVar81._4_4_;
    fStack_678 = auVar81._8_4_;
    fStack_674 = auVar81._12_4_;
    fStack_670 = auVar81._16_4_;
    fStack_66c = auVar81._20_4_;
    fStack_668 = auVar81._24_4_;
    auVar24._4_4_ = fVar215 * (float)local_680._4_4_;
    auVar24._0_4_ = fVar201 * (float)local_680._0_4_;
    auVar24._8_4_ = fVar216 * fStack_678;
    auVar24._12_4_ = fVar217 * fStack_674;
    auVar24._16_4_ = fVar91 * fStack_670;
    auVar24._20_4_ = fVar92 * fStack_66c;
    auVar24._24_4_ = fVar93 * fStack_668;
    auVar24._28_4_ = local_200._28_4_;
    auVar21 = vsubps_avx(auVar23,auVar24);
    auVar25._4_4_ = local_220._4_4_ * fVar197;
    auVar25._0_4_ = local_220._0_4_ * fVar150;
    auVar25._8_4_ = local_220._8_4_ * fVar157;
    auVar25._12_4_ = local_220._12_4_ * fVar198;
    auVar25._16_4_ = local_220._16_4_ * fVar158;
    auVar25._20_4_ = local_220._20_4_ * fVar199;
    auVar25._24_4_ = local_220._24_4_ * fVar159;
    auVar25._28_4_ = fVar290;
    auVar26._4_4_ = local_540._4_4_ * fVar215;
    auVar26._0_4_ = local_540._0_4_ * fVar201;
    auVar26._8_4_ = local_540._8_4_ * fVar216;
    auVar26._12_4_ = local_540._12_4_ * fVar217;
    auVar26._16_4_ = local_540._16_4_ * fVar91;
    auVar26._20_4_ = local_540._20_4_ * fVar92;
    auVar26._24_4_ = local_540._24_4_ * fVar93;
    auVar26._28_4_ = local_220._28_4_;
    local_5c0 = auVar15._0_4_;
    fStack_5bc = auVar15._4_4_;
    fStack_5b8 = auVar15._8_4_;
    fStack_5b4 = auVar15._12_4_;
    fStack_5b0 = auVar15._16_4_;
    fStack_5ac = auVar15._20_4_;
    fStack_5a8 = auVar15._24_4_;
    auVar22 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = auVar258._4_4_ * fVar197;
    auVar27._0_4_ = auVar258._0_4_ * fVar150;
    auVar27._8_4_ = auVar258._8_4_ * fVar157;
    auVar27._12_4_ = auVar258._12_4_ * fVar198;
    auVar27._16_4_ = auVar258._16_4_ * fVar158;
    auVar27._20_4_ = auVar258._20_4_ * fVar199;
    auVar27._24_4_ = auVar258._24_4_ * fVar159;
    auVar27._28_4_ = fVar290;
    auVar28._4_4_ = fVar215 * auVar228._4_4_;
    auVar28._0_4_ = fVar201 * auVar228._0_4_;
    auVar28._8_4_ = fVar216 * auVar228._8_4_;
    auVar28._12_4_ = fVar217 * auVar228._12_4_;
    auVar28._16_4_ = fVar91 * auVar228._16_4_;
    auVar28._20_4_ = fVar92 * auVar228._20_4_;
    auVar28._24_4_ = fVar93 * auVar228._24_4_;
    auVar28._28_4_ = fStack_224;
    auVar23 = vsubps_avx(auVar27,auVar28);
    local_280 = auVar228._0_4_ + local_280;
    fStack_27c = auVar228._4_4_ + fStack_27c;
    fStack_278 = auVar228._8_4_ + fStack_278;
    fStack_274 = auVar228._12_4_ + fStack_274;
    fStack_270 = auVar228._16_4_ + fStack_270;
    fStack_26c = auVar228._20_4_ + fStack_26c;
    fStack_268 = auVar228._24_4_ + fStack_268;
    fStack_264 = auVar228._28_4_ + auVar17._28_4_;
    local_2a0 = auVar258._0_4_ + local_2a0;
    fStack_29c = auVar258._4_4_ + fStack_29c;
    fStack_298 = auVar258._8_4_ + fStack_298;
    fStack_294 = auVar258._12_4_ + fStack_294;
    fStack_290 = auVar258._16_4_ + fStack_290;
    fStack_28c = auVar258._20_4_ + fStack_28c;
    fStack_288 = auVar258._24_4_ + fStack_288;
    fStack_284 = auVar258._28_4_ + auVar196._28_4_;
    auVar17._4_4_ = fVar197 * fStack_29c;
    auVar17._0_4_ = fVar150 * local_2a0;
    auVar17._8_4_ = fVar157 * fStack_298;
    auVar17._12_4_ = fVar198 * fStack_294;
    auVar17._16_4_ = fVar158 * fStack_290;
    auVar17._20_4_ = fVar199 * fStack_28c;
    auVar17._24_4_ = fVar159 * fStack_288;
    auVar17._28_4_ = auVar258._28_4_ + auVar196._28_4_;
    auVar29._4_4_ = fStack_27c * fVar215;
    auVar29._0_4_ = local_280 * fVar201;
    auVar29._8_4_ = fStack_278 * fVar216;
    auVar29._12_4_ = fStack_274 * fVar217;
    auVar29._16_4_ = fStack_270 * fVar91;
    auVar29._20_4_ = fStack_26c * fVar92;
    auVar29._24_4_ = fStack_268 * fVar93;
    auVar29._28_4_ = fStack_264;
    auVar17 = vsubps_avx(auVar17,auVar29);
    auVar30._4_4_ = fVar197 * auVar18._4_4_;
    auVar30._0_4_ = fVar150 * auVar18._0_4_;
    auVar30._8_4_ = fVar157 * auVar18._8_4_;
    auVar30._12_4_ = fVar198 * auVar18._12_4_;
    auVar30._16_4_ = fVar158 * auVar18._16_4_;
    auVar30._20_4_ = fVar199 * auVar18._20_4_;
    auVar30._24_4_ = fVar159 * auVar18._24_4_;
    auVar30._28_4_ = fStack_264;
    auVar31._4_4_ = fVar215 * fStack_5bc;
    auVar31._0_4_ = fVar201 * local_5c0;
    auVar31._8_4_ = fVar216 * fStack_5b8;
    auVar31._12_4_ = fVar217 * fStack_5b4;
    auVar31._16_4_ = fVar91 * fStack_5b0;
    auVar31._20_4_ = fVar92 * fStack_5ac;
    auVar31._24_4_ = fVar93 * fStack_5a8;
    auVar31._28_4_ = auVar18._28_4_;
    auVar24 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = fVar197 * local_1e0._4_4_;
    auVar32._0_4_ = fVar150 * local_1e0._0_4_;
    auVar32._8_4_ = fVar157 * local_1e0._8_4_;
    auVar32._12_4_ = fVar198 * local_1e0._12_4_;
    auVar32._16_4_ = fVar158 * local_1e0._16_4_;
    auVar32._20_4_ = fVar199 * local_1e0._20_4_;
    auVar32._24_4_ = fVar159 * local_1e0._24_4_;
    auVar32._28_4_ = auVar83._28_4_ + auVar19._28_4_;
    auVar19._4_4_ = auVar82._4_4_ * fVar215;
    auVar19._0_4_ = auVar82._0_4_ * fVar201;
    auVar19._8_4_ = auVar82._8_4_ * fVar216;
    auVar19._12_4_ = auVar82._12_4_ * fVar217;
    auVar19._16_4_ = auVar82._16_4_ * fVar91;
    auVar19._20_4_ = auVar82._20_4_ * fVar92;
    auVar19._24_4_ = auVar82._24_4_ * fVar93;
    auVar19._28_4_ = auVar84._28_4_ + auVar13._28_4_;
    auVar19 = vsubps_avx(auVar32,auVar19);
    auVar15 = vminps_avx(auVar20,auVar14);
    auVar81 = vmaxps_avx(auVar20,auVar14);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar21,auVar22);
    auVar81 = vmaxps_avx(auVar81,auVar15);
    auVar13 = vminps_avx(auVar23,auVar17);
    auVar15 = vmaxps_avx(auVar23,auVar17);
    auVar14 = vminps_avx(auVar24,auVar19);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar14 = vminps_avx(auVar16,auVar14);
    auVar16 = vmaxps_avx(auVar24,auVar19);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar81,auVar15);
    auVar81 = vcmpps_avx(auVar14,local_1c0,2);
    auVar15 = vcmpps_avx(auVar15,local_340,5);
    auVar81 = vandps_avx(auVar15,auVar81);
    auVar15 = local_2c0 & auVar81;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(_local_540,local_200);
      auVar16 = vsubps_avx(auVar82,auVar228);
      fVar197 = auVar15._0_4_ + auVar16._0_4_;
      fVar157 = auVar15._4_4_ + auVar16._4_4_;
      fVar198 = auVar15._8_4_ + auVar16._8_4_;
      fVar158 = auVar15._12_4_ + auVar16._12_4_;
      fVar199 = auVar15._16_4_ + auVar16._16_4_;
      fVar159 = auVar15._20_4_ + auVar16._20_4_;
      fVar201 = auVar15._24_4_ + auVar16._24_4_;
      auVar14 = vsubps_avx(local_220,auVar156);
      auVar17 = vsubps_avx(local_1e0,auVar258);
      fVar215 = auVar14._0_4_ + auVar17._0_4_;
      fVar216 = auVar14._4_4_ + auVar17._4_4_;
      fVar217 = auVar14._8_4_ + auVar17._8_4_;
      fVar91 = auVar14._12_4_ + auVar17._12_4_;
      fVar92 = auVar14._16_4_ + auVar17._16_4_;
      fVar93 = auVar14._20_4_ + auVar17._20_4_;
      fVar94 = auVar14._24_4_ + auVar17._24_4_;
      fVar150 = auVar17._28_4_;
      auVar33._4_4_ = auVar156._4_4_ * fVar157;
      auVar33._0_4_ = auVar156._0_4_ * fVar197;
      auVar33._8_4_ = auVar156._8_4_ * fVar198;
      auVar33._12_4_ = auVar156._12_4_ * fVar158;
      auVar33._16_4_ = auVar156._16_4_ * fVar199;
      auVar33._20_4_ = auVar156._20_4_ * fVar159;
      auVar33._24_4_ = auVar156._24_4_ * fVar201;
      auVar33._28_4_ = auVar156._28_4_;
      auVar34._4_4_ = local_200._4_4_ * fVar216;
      auVar34._0_4_ = local_200._0_4_ * fVar215;
      auVar34._8_4_ = local_200._8_4_ * fVar217;
      auVar34._12_4_ = local_200._12_4_ * fVar91;
      auVar34._16_4_ = local_200._16_4_ * fVar92;
      auVar34._20_4_ = local_200._20_4_ * fVar93;
      auVar34._24_4_ = local_200._24_4_ * fVar94;
      auVar34._28_4_ = local_200._28_4_;
      auVar17 = vsubps_avx(auVar33,auVar34);
      auVar35._4_4_ = fVar157 * fStack_25c;
      auVar35._0_4_ = fVar197 * local_260;
      auVar35._8_4_ = fVar198 * fStack_258;
      auVar35._12_4_ = fVar158 * fStack_254;
      auVar35._16_4_ = fVar199 * fStack_250;
      auVar35._20_4_ = fVar159 * fStack_24c;
      auVar35._24_4_ = fVar201 * fStack_248;
      auVar35._28_4_ = auVar156._28_4_;
      auVar36._4_4_ = fVar216 * fStack_23c;
      auVar36._0_4_ = fVar215 * local_240;
      auVar36._8_4_ = fVar217 * fStack_238;
      auVar36._12_4_ = fVar91 * fStack_234;
      auVar36._16_4_ = fVar92 * fStack_230;
      auVar36._20_4_ = fVar93 * fStack_22c;
      auVar36._24_4_ = fVar94 * fStack_228;
      auVar36._28_4_ = fVar150;
      auVar19 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = fVar157 * (float)local_620._4_4_;
      auVar37._0_4_ = fVar197 * (float)local_620._0_4_;
      auVar37._8_4_ = fVar198 * fStack_618;
      auVar37._12_4_ = fVar158 * fStack_614;
      auVar37._16_4_ = fVar199 * fStack_610;
      auVar37._20_4_ = fVar159 * fStack_60c;
      auVar37._24_4_ = fVar201 * fStack_608;
      auVar37._28_4_ = fVar150;
      auVar38._4_4_ = fVar216 * (float)local_680._4_4_;
      auVar38._0_4_ = fVar215 * (float)local_680._0_4_;
      auVar38._8_4_ = fVar217 * fStack_678;
      auVar38._12_4_ = fVar91 * fStack_674;
      auVar38._16_4_ = fVar92 * fStack_670;
      auVar38._20_4_ = fVar93 * fStack_66c;
      auVar38._24_4_ = fVar94 * fStack_668;
      auVar38._28_4_ = auVar13._28_4_;
      auVar83 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = local_220._4_4_ * fVar157;
      auVar39._0_4_ = local_220._0_4_ * fVar197;
      auVar39._8_4_ = local_220._8_4_ * fVar198;
      auVar39._12_4_ = local_220._12_4_ * fVar158;
      auVar39._16_4_ = local_220._16_4_ * fVar199;
      auVar39._20_4_ = local_220._20_4_ * fVar159;
      auVar39._24_4_ = local_220._24_4_ * fVar201;
      auVar39._28_4_ = auVar13._28_4_;
      auVar40._4_4_ = local_540._4_4_ * fVar216;
      auVar40._0_4_ = local_540._0_4_ * fVar215;
      auVar40._8_4_ = local_540._8_4_ * fVar217;
      auVar40._12_4_ = local_540._12_4_ * fVar91;
      auVar40._16_4_ = local_540._16_4_ * fVar92;
      auVar40._20_4_ = local_540._20_4_ * fVar93;
      uVar2 = local_540._28_4_;
      auVar40._24_4_ = local_540._24_4_ * fVar94;
      auVar40._28_4_ = uVar2;
      auVar84 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = auVar258._4_4_ * fVar157;
      auVar41._0_4_ = auVar258._0_4_ * fVar197;
      auVar41._8_4_ = auVar258._8_4_ * fVar198;
      auVar41._12_4_ = auVar258._12_4_ * fVar158;
      auVar41._16_4_ = auVar258._16_4_ * fVar199;
      auVar41._20_4_ = auVar258._20_4_ * fVar159;
      auVar41._24_4_ = auVar258._24_4_ * fVar201;
      auVar41._28_4_ = uVar2;
      auVar42._4_4_ = auVar228._4_4_ * fVar216;
      auVar42._0_4_ = auVar228._0_4_ * fVar215;
      auVar42._8_4_ = auVar228._8_4_ * fVar217;
      auVar42._12_4_ = auVar228._12_4_ * fVar91;
      auVar42._16_4_ = auVar228._16_4_ * fVar92;
      auVar42._20_4_ = auVar228._20_4_ * fVar93;
      auVar42._24_4_ = auVar228._24_4_ * fVar94;
      auVar42._28_4_ = auVar228._28_4_;
      auVar20 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar157 * fStack_29c;
      auVar43._0_4_ = fVar197 * local_2a0;
      auVar43._8_4_ = fVar198 * fStack_298;
      auVar43._12_4_ = fVar158 * fStack_294;
      auVar43._16_4_ = fVar199 * fStack_290;
      auVar43._20_4_ = fVar159 * fStack_28c;
      auVar43._24_4_ = fVar201 * fStack_288;
      auVar43._28_4_ = uVar2;
      auVar44._4_4_ = fVar216 * fStack_27c;
      auVar44._0_4_ = fVar215 * local_280;
      auVar44._8_4_ = fVar217 * fStack_278;
      auVar44._12_4_ = fVar91 * fStack_274;
      auVar44._16_4_ = fVar92 * fStack_270;
      auVar44._20_4_ = fVar93 * fStack_26c;
      auVar44._24_4_ = fVar94 * fStack_268;
      auVar44._28_4_ = auVar258._28_4_;
      auVar21 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar157 * auVar18._4_4_;
      auVar45._0_4_ = fVar197 * auVar18._0_4_;
      auVar45._8_4_ = fVar198 * auVar18._8_4_;
      auVar45._12_4_ = fVar158 * auVar18._12_4_;
      auVar45._16_4_ = fVar199 * auVar18._16_4_;
      auVar45._20_4_ = fVar159 * auVar18._20_4_;
      auVar45._24_4_ = fVar201 * auVar18._24_4_;
      auVar45._28_4_ = auVar258._28_4_;
      auVar46._4_4_ = fStack_5bc * fVar216;
      auVar46._0_4_ = local_5c0 * fVar215;
      auVar46._8_4_ = fStack_5b8 * fVar217;
      auVar46._12_4_ = fStack_5b4 * fVar91;
      auVar46._16_4_ = fStack_5b0 * fVar92;
      auVar46._20_4_ = fStack_5ac * fVar93;
      auVar46._24_4_ = fStack_5a8 * fVar94;
      auVar46._28_4_ = local_220._28_4_;
      auVar18 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_1e0._4_4_ * fVar157;
      auVar47._0_4_ = local_1e0._0_4_ * fVar197;
      auVar47._8_4_ = local_1e0._8_4_ * fVar198;
      auVar47._12_4_ = local_1e0._12_4_ * fVar158;
      auVar47._16_4_ = local_1e0._16_4_ * fVar199;
      auVar47._20_4_ = local_1e0._20_4_ * fVar159;
      auVar47._24_4_ = local_1e0._24_4_ * fVar201;
      auVar47._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar48._4_4_ = auVar82._4_4_ * fVar216;
      auVar48._0_4_ = auVar82._0_4_ * fVar215;
      auVar48._8_4_ = auVar82._8_4_ * fVar217;
      auVar48._12_4_ = auVar82._12_4_ * fVar91;
      auVar48._16_4_ = auVar82._16_4_ * fVar92;
      auVar48._20_4_ = auVar82._20_4_ * fVar93;
      auVar48._24_4_ = auVar82._24_4_ * fVar94;
      auVar48._28_4_ = auVar14._28_4_ + fVar150;
      auVar22 = vsubps_avx(auVar47,auVar48);
      auVar16 = vminps_avx(auVar17,auVar19);
      auVar15 = vmaxps_avx(auVar17,auVar19);
      auVar13 = vminps_avx(auVar83,auVar84);
      auVar13 = vminps_avx(auVar16,auVar13);
      auVar16 = vmaxps_avx(auVar83,auVar84);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar14 = vminps_avx(auVar20,auVar21);
      auVar16 = vmaxps_avx(auVar20,auVar21);
      auVar82 = vminps_avx(auVar18,auVar22);
      auVar14 = vminps_avx(auVar14,auVar82);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar18,auVar22);
      auVar16 = vmaxps_avx(auVar16,auVar13);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar14,local_1c0,2);
      auVar16 = vcmpps_avx(auVar16,local_340,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar81 = vandps_avx(local_2c0,auVar81);
      auVar16 = auVar81 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar15,auVar81);
        uVar59 = vmovmskps_avx(auVar81);
        if (uVar59 != 0) {
          uVar55 = (ulong)uVar61;
          auStack_4a0[uVar55] = uVar59 & 0xff;
          uVar3 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar55 * 2) = uVar3;
          uVar60 = vmovlps_avx(auVar126);
          auStack_1a0[uVar55] = uVar60;
          uVar61 = uVar61 + 1;
        }
      }
    }
LAB_00e4012f:
    do {
      do {
        do {
          do {
            if (uVar61 == 0) {
              if (bVar62) {
                return bVar62;
              }
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar80._4_4_ = uVar2;
              auVar80._0_4_ = uVar2;
              auVar80._8_4_ = uVar2;
              auVar80._12_4_ = uVar2;
              auVar146 = vcmpps_avx(local_410,auVar80,2);
              uVar53 = vmovmskps_avx(auVar146);
              uVar53 = (uint)uVar57 & uVar53;
              if (uVar53 == 0) {
                return bVar62;
              }
              goto LAB_00e3f1d0;
            }
            uVar55 = (ulong)(uVar61 - 1);
            uVar59 = auStack_4a0[uVar55];
            fVar150 = afStack_320[uVar55 * 2];
            fVar197 = afStack_320[uVar55 * 2 + 1];
            auVar208._8_8_ = 0;
            auVar208._0_8_ = auStack_1a0[uVar55];
            auVar214 = ZEXT1664(auVar208);
            uVar60 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
              }
            }
            uVar59 = uVar59 - 1 & uVar59;
            auStack_4a0[uVar55] = uVar59;
            if (uVar59 == 0) {
              uVar61 = uVar61 - 1;
            }
            fVar198 = (float)(uVar60 + 1) * 0.14285715;
            fVar157 = (1.0 - (float)uVar60 * 0.14285715) * fVar150 +
                      fVar197 * (float)uVar60 * 0.14285715;
            fVar150 = (1.0 - fVar198) * fVar150 + fVar197 * fVar198;
            fVar197 = fVar150 - fVar157;
            if (0.16666667 <= fVar197) {
              auVar146 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar150),0x10);
              auVar297 = ZEXT1664(auVar146);
              goto LAB_00e3fac0;
            }
            auVar146 = vshufps_avx(auVar208,auVar208,0x50);
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar205 = vsubps_avx(auVar100,auVar146);
            fVar201 = auVar146._0_4_;
            fVar215 = auVar146._4_4_;
            fVar216 = auVar146._8_4_;
            fVar217 = auVar146._12_4_;
            fVar198 = auVar205._0_4_;
            fVar158 = auVar205._4_4_;
            fVar199 = auVar205._8_4_;
            fVar159 = auVar205._12_4_;
            auVar131._0_4_ = fVar201 * auVar187._0_4_ + fVar95 * fVar198;
            auVar131._4_4_ = fVar215 * auVar187._4_4_ + fVar121 * fVar158;
            auVar131._8_4_ = fVar216 * auVar187._0_4_ + fVar95 * fVar199;
            auVar131._12_4_ = fVar217 * auVar187._4_4_ + fVar121 * fVar159;
            auVar165._0_4_ = auVar282._0_4_ * fVar201 + fVar96 * fVar198;
            auVar165._4_4_ = auVar282._4_4_ * fVar215 + fVar122 * fVar158;
            auVar165._8_4_ = auVar282._0_4_ * fVar216 + fVar96 * fVar199;
            auVar165._12_4_ = auVar282._4_4_ * fVar217 + fVar122 * fVar159;
            auVar188._0_4_ = auVar266._0_4_ * fVar201 + fVar97 * fVar198;
            auVar188._4_4_ = auVar266._4_4_ * fVar215 + fVar123 * fVar158;
            auVar188._8_4_ = auVar266._0_4_ * fVar216 + fVar97 * fVar199;
            auVar188._12_4_ = auVar266._4_4_ * fVar217 + fVar123 * fVar159;
            auVar67._0_4_ = auVar251._0_4_ * fVar201 + auVar294._0_4_ * fVar198;
            auVar67._4_4_ = auVar251._4_4_ * fVar215 + auVar294._4_4_ * fVar158;
            auVar67._8_4_ = auVar251._0_4_ * fVar216 + auVar294._0_4_ * fVar199;
            auVar67._12_4_ = auVar251._4_4_ * fVar217 + auVar294._4_4_ * fVar159;
            auVar117._16_16_ = auVar131;
            auVar117._0_16_ = auVar131;
            auVar147._16_16_ = auVar165;
            auVar147._0_16_ = auVar165;
            auVar177._16_16_ = auVar188;
            auVar177._0_16_ = auVar188;
            auVar81 = ZEXT2032(CONCAT416(fVar150,ZEXT416((uint)fVar157)));
            auVar81 = vshufps_avx(auVar81,auVar81,0);
            auVar15 = vsubps_avx(auVar147,auVar117);
            fVar198 = auVar81._0_4_;
            fVar158 = auVar81._4_4_;
            fVar199 = auVar81._8_4_;
            fVar159 = auVar81._12_4_;
            fVar201 = auVar81._16_4_;
            fVar215 = auVar81._20_4_;
            fVar216 = auVar81._24_4_;
            auVar118._0_4_ = auVar131._0_4_ + auVar15._0_4_ * fVar198;
            auVar118._4_4_ = auVar131._4_4_ + auVar15._4_4_ * fVar158;
            auVar118._8_4_ = auVar131._8_4_ + auVar15._8_4_ * fVar199;
            auVar118._12_4_ = auVar131._12_4_ + auVar15._12_4_ * fVar159;
            auVar118._16_4_ = auVar131._0_4_ + auVar15._16_4_ * fVar201;
            auVar118._20_4_ = auVar131._4_4_ + auVar15._20_4_ * fVar215;
            auVar118._24_4_ = auVar131._8_4_ + auVar15._24_4_ * fVar216;
            auVar118._28_4_ = auVar131._12_4_ + auVar15._28_4_;
            auVar81 = vsubps_avx(auVar177,auVar147);
            auVar148._0_4_ = auVar165._0_4_ + auVar81._0_4_ * fVar198;
            auVar148._4_4_ = auVar165._4_4_ + auVar81._4_4_ * fVar158;
            auVar148._8_4_ = auVar165._8_4_ + auVar81._8_4_ * fVar199;
            auVar148._12_4_ = auVar165._12_4_ + auVar81._12_4_ * fVar159;
            auVar148._16_4_ = auVar165._0_4_ + auVar81._16_4_ * fVar201;
            auVar148._20_4_ = auVar165._4_4_ + auVar81._20_4_ * fVar215;
            auVar148._24_4_ = auVar165._8_4_ + auVar81._24_4_ * fVar216;
            auVar148._28_4_ = auVar165._12_4_ + auVar81._28_4_;
            auVar146 = vsubps_avx(auVar67,auVar188);
            auVar85._0_4_ = auVar188._0_4_ + auVar146._0_4_ * fVar198;
            auVar85._4_4_ = auVar188._4_4_ + auVar146._4_4_ * fVar158;
            auVar85._8_4_ = auVar188._8_4_ + auVar146._8_4_ * fVar199;
            auVar85._12_4_ = auVar188._12_4_ + auVar146._12_4_ * fVar159;
            auVar85._16_4_ = auVar188._0_4_ + auVar146._0_4_ * fVar201;
            auVar85._20_4_ = auVar188._4_4_ + auVar146._4_4_ * fVar215;
            auVar85._24_4_ = auVar188._8_4_ + auVar146._8_4_ * fVar216;
            auVar85._28_4_ = auVar188._12_4_ + auVar146._12_4_;
            auVar81 = vsubps_avx(auVar148,auVar118);
            auVar119._0_4_ = auVar118._0_4_ + fVar198 * auVar81._0_4_;
            auVar119._4_4_ = auVar118._4_4_ + fVar158 * auVar81._4_4_;
            auVar119._8_4_ = auVar118._8_4_ + fVar199 * auVar81._8_4_;
            auVar119._12_4_ = auVar118._12_4_ + fVar159 * auVar81._12_4_;
            auVar119._16_4_ = auVar118._16_4_ + fVar201 * auVar81._16_4_;
            auVar119._20_4_ = auVar118._20_4_ + fVar215 * auVar81._20_4_;
            auVar119._24_4_ = auVar118._24_4_ + fVar216 * auVar81._24_4_;
            auVar119._28_4_ = auVar118._28_4_ + auVar81._28_4_;
            auVar81 = vsubps_avx(auVar85,auVar148);
            auVar86._0_4_ = auVar148._0_4_ + fVar198 * auVar81._0_4_;
            auVar86._4_4_ = auVar148._4_4_ + fVar158 * auVar81._4_4_;
            auVar86._8_4_ = auVar148._8_4_ + fVar199 * auVar81._8_4_;
            auVar86._12_4_ = auVar148._12_4_ + fVar159 * auVar81._12_4_;
            auVar86._16_4_ = auVar148._16_4_ + fVar201 * auVar81._16_4_;
            auVar86._20_4_ = auVar148._20_4_ + fVar215 * auVar81._20_4_;
            auVar86._24_4_ = auVar148._24_4_ + fVar216 * auVar81._24_4_;
            auVar86._28_4_ = auVar148._28_4_ + auVar81._28_4_;
            auVar81 = vsubps_avx(auVar86,auVar119);
            auVar209._0_4_ = auVar119._0_4_ + fVar198 * auVar81._0_4_;
            auVar209._4_4_ = auVar119._4_4_ + fVar158 * auVar81._4_4_;
            auVar209._8_4_ = auVar119._8_4_ + fVar199 * auVar81._8_4_;
            auVar209._12_4_ = auVar119._12_4_ + fVar159 * auVar81._12_4_;
            auVar213._16_4_ = auVar119._16_4_ + fVar201 * auVar81._16_4_;
            auVar213._0_16_ = auVar209;
            auVar213._20_4_ = auVar119._20_4_ + fVar215 * auVar81._20_4_;
            auVar213._24_4_ = auVar119._24_4_ + fVar216 * auVar81._24_4_;
            auVar213._28_4_ = auVar119._28_4_ + auVar148._28_4_;
            auVar98 = auVar213._16_16_;
            auVar102 = vshufps_avx(ZEXT416((uint)(fVar197 * 0.33333334)),
                                   ZEXT416((uint)(fVar197 * 0.33333334)),0);
            auVar189._0_4_ = auVar209._0_4_ + auVar102._0_4_ * auVar81._0_4_ * 3.0;
            auVar189._4_4_ = auVar209._4_4_ + auVar102._4_4_ * auVar81._4_4_ * 3.0;
            auVar189._8_4_ = auVar209._8_4_ + auVar102._8_4_ * auVar81._8_4_ * 3.0;
            auVar189._12_4_ = auVar209._12_4_ + auVar102._12_4_ * auVar81._12_4_ * 3.0;
            auVar144 = vshufpd_avx(auVar209,auVar209,3);
            auVar65 = vshufpd_avx(auVar98,auVar98,3);
            _local_540 = auVar144;
            auVar146 = vsubps_avx(auVar144,auVar209);
            auVar205 = vsubps_avx(auVar65,auVar98);
            auVar68._0_4_ = auVar146._0_4_ + auVar205._0_4_;
            auVar68._4_4_ = auVar146._4_4_ + auVar205._4_4_;
            auVar68._8_4_ = auVar146._8_4_ + auVar205._8_4_;
            auVar68._12_4_ = auVar146._12_4_ + auVar205._12_4_;
            auVar146 = vmovshdup_avx(auVar209);
            auVar205 = vmovshdup_avx(auVar189);
            auVar134 = vshufps_avx(auVar68,auVar68,0);
            auVar64 = vshufps_avx(auVar68,auVar68,0x55);
            fVar198 = auVar64._0_4_;
            fVar158 = auVar64._4_4_;
            fVar199 = auVar64._8_4_;
            fVar159 = auVar64._12_4_;
            fVar201 = auVar134._0_4_;
            fVar215 = auVar134._4_4_;
            fVar216 = auVar134._8_4_;
            fVar217 = auVar134._12_4_;
            auVar69._0_4_ = fVar201 * auVar209._0_4_ + auVar146._0_4_ * fVar198;
            auVar69._4_4_ = fVar215 * auVar209._4_4_ + auVar146._4_4_ * fVar158;
            auVar69._8_4_ = fVar216 * auVar209._8_4_ + auVar146._8_4_ * fVar199;
            auVar69._12_4_ = fVar217 * auVar209._12_4_ + auVar146._12_4_ * fVar159;
            auVar132._0_4_ = fVar201 * auVar189._0_4_ + auVar205._0_4_ * fVar198;
            auVar132._4_4_ = fVar215 * auVar189._4_4_ + auVar205._4_4_ * fVar158;
            auVar132._8_4_ = fVar216 * auVar189._8_4_ + auVar205._8_4_ * fVar199;
            auVar132._12_4_ = fVar217 * auVar189._12_4_ + auVar205._12_4_ * fVar159;
            auVar205 = vshufps_avx(auVar69,auVar69,0xe8);
            auVar134 = vshufps_avx(auVar132,auVar132,0xe8);
            auVar146 = vcmpps_avx(auVar205,auVar134,1);
            uVar59 = vextractps_avx(auVar146,0);
            auVar64 = auVar132;
            if ((uVar59 & 1) == 0) {
              auVar64 = auVar69;
            }
            auVar101._0_4_ = auVar102._0_4_ * auVar81._16_4_ * 3.0;
            auVar101._4_4_ = auVar102._4_4_ * auVar81._20_4_ * 3.0;
            auVar101._8_4_ = auVar102._8_4_ * auVar81._24_4_ * 3.0;
            auVar101._12_4_ = auVar102._12_4_ * 0.0;
            auVar124 = vsubps_avx(auVar98,auVar101);
            auVar102 = vmovshdup_avx(auVar124);
            auVar98 = vmovshdup_avx(auVar98);
            fVar91 = auVar124._0_4_;
            fVar92 = auVar124._4_4_;
            auVar166._0_4_ = fVar91 * fVar201 + auVar102._0_4_ * fVar198;
            auVar166._4_4_ = fVar92 * fVar215 + auVar102._4_4_ * fVar158;
            auVar166._8_4_ = auVar124._8_4_ * fVar216 + auVar102._8_4_ * fVar199;
            auVar166._12_4_ = auVar124._12_4_ * fVar217 + auVar102._12_4_ * fVar159;
            auVar190._0_4_ = fVar201 * auVar213._16_4_ + auVar98._0_4_ * fVar198;
            auVar190._4_4_ = fVar215 * auVar213._20_4_ + auVar98._4_4_ * fVar158;
            auVar190._8_4_ = fVar216 * auVar213._24_4_ + auVar98._8_4_ * fVar199;
            auVar190._12_4_ = fVar217 * auVar213._28_4_ + auVar98._12_4_ * fVar159;
            auVar98 = vshufps_avx(auVar166,auVar166,0xe8);
            auVar125 = vshufps_avx(auVar190,auVar190,0xe8);
            auVar102 = vcmpps_avx(auVar98,auVar125,1);
            uVar59 = vextractps_avx(auVar102,0);
            auVar126 = auVar190;
            if ((uVar59 & 1) == 0) {
              auVar126 = auVar166;
            }
            auVar64 = vmaxss_avx(auVar126,auVar64);
            auVar205 = vminps_avx(auVar205,auVar134);
            auVar134 = vminps_avx(auVar98,auVar125);
            auVar134 = vminps_avx(auVar205,auVar134);
            auVar146 = vshufps_avx(auVar146,auVar146,0x55);
            auVar146 = vblendps_avx(auVar146,auVar102,2);
            auVar102 = vpslld_avx(auVar146,0x1f);
            auVar146 = vshufpd_avx(auVar132,auVar132,1);
            auVar146 = vinsertps_avx(auVar146,auVar190,0x9c);
            auVar205 = vshufpd_avx(auVar69,auVar69,1);
            auVar205 = vinsertps_avx(auVar205,auVar166,0x9c);
            auVar146 = vblendvps_avx(auVar205,auVar146,auVar102);
            auVar205 = vmovshdup_avx(auVar146);
            auVar146 = vmaxss_avx(auVar205,auVar146);
            fVar199 = auVar134._0_4_;
            auVar205 = vmovshdup_avx(auVar134);
            fVar158 = auVar146._0_4_;
            fVar159 = auVar205._0_4_;
            fVar198 = auVar64._0_4_;
            if ((fVar199 < 0.0001) && (-0.0001 < fVar158)) break;
            if ((fVar159 < 0.0001 && -0.0001 < fVar198) || (fVar199 < 0.0001 && -0.0001 < fVar198))
            break;
            auVar102 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar146,1);
            auVar205 = vcmpps_avx(auVar205,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar205 = vandps_avx(auVar205,auVar102);
          } while ((auVar205 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar102 = vcmpps_avx(auVar134,_DAT_01f7aa10,1);
          auVar205 = vcmpss_avx(auVar64,ZEXT416(0),1);
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = 0x3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar167._8_4_ = 0xbf800000;
          auVar167._0_8_ = 0xbf800000bf800000;
          auVar167._12_4_ = 0xbf800000;
          auVar205 = vblendvps_avx(auVar133,auVar167,auVar205);
          auVar102 = vblendvps_avx(auVar133,auVar167,auVar102);
          auVar134 = vcmpss_avx(auVar102,auVar205,4);
          auVar134 = vpshufd_avx(ZEXT416(auVar134._0_4_ & 1),0x50);
          auVar134 = vpslld_avx(auVar134,0x1f);
          auVar134 = vpsrad_avx(auVar134,0x1f);
          auVar134 = vpandn_avx(auVar134,_DAT_01fafeb0);
          auVar64 = vmovshdup_avx(auVar102);
          fVar201 = auVar64._0_4_;
          local_690._0_4_ = auVar11._0_4_;
          local_690._4_4_ = auVar11._4_4_;
          fStack_688 = auVar11._8_4_;
          fStack_684 = auVar11._12_4_;
          if ((auVar102._0_4_ != fVar201) || (NAN(auVar102._0_4_) || NAN(fVar201))) {
            if ((fVar159 != fVar199) || (NAN(fVar159) || NAN(fVar199))) {
              fVar199 = -fVar199 / (fVar159 - fVar199);
              auVar102 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar199) * 0.0 + fVar199)));
            }
            else {
              auVar102 = ZEXT816(0x3f80000000000000);
              if ((fVar199 != 0.0) || (NAN(fVar199))) {
                auVar102 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar98 = vcmpps_avx(auVar134,auVar102,1);
            auVar64 = vblendps_avx(auVar134,auVar102,2);
            auVar102 = vblendps_avx(auVar102,auVar134,2);
            auVar134 = vblendvps_avx(auVar102,auVar64,auVar98);
          }
          auVar146 = vcmpss_avx(auVar146,ZEXT416(0),1);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar168._8_4_ = 0xbf800000;
          auVar168._0_8_ = 0xbf800000bf800000;
          auVar168._12_4_ = 0xbf800000;
          auVar146 = vblendvps_avx(auVar135,auVar168,auVar146);
          fVar199 = auVar146._0_4_;
          if ((auVar205._0_4_ != fVar199) || (NAN(auVar205._0_4_) || NAN(fVar199))) {
            if ((fVar158 != fVar198) || (NAN(fVar158) || NAN(fVar198))) {
              fVar198 = -fVar198 / (fVar158 - fVar198);
              auVar146 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar198) * 0.0 + fVar198)));
            }
            else {
              auVar146 = ZEXT816(0x3f80000000000000);
              if ((fVar198 != 0.0) || (NAN(fVar198))) {
                auVar146 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar102 = vcmpps_avx(auVar134,auVar146,1);
            auVar205 = vblendps_avx(auVar134,auVar146,2);
            auVar146 = vblendps_avx(auVar146,auVar134,2);
            auVar134 = vblendvps_avx(auVar146,auVar205,auVar102);
          }
          if ((fVar201 != fVar199) || (NAN(fVar201) || NAN(fVar199))) {
            auVar70._8_4_ = 0x3f800000;
            auVar70._0_8_ = 0x3f8000003f800000;
            auVar70._12_4_ = 0x3f800000;
            auVar146 = vcmpps_avx(auVar134,auVar70,1);
            auVar205 = vinsertps_avx(auVar134,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar136._4_12_ = auVar134._4_12_;
            auVar136._0_4_ = 0x3f800000;
            auVar134 = vblendvps_avx(auVar136,auVar205,auVar146);
          }
          auVar146 = vcmpps_avx(auVar134,_DAT_01f7b6f0,1);
          auVar49._12_4_ = 0;
          auVar49._0_12_ = auVar134._4_12_;
          auVar205 = vinsertps_avx(auVar134,ZEXT416(0x3f800000),0x10);
          auVar146 = vblendvps_avx(auVar205,auVar49 << 0x20,auVar146);
          auVar205 = vmovshdup_avx(auVar146);
        } while (auVar205._0_4_ < auVar146._0_4_);
        auVar71._0_4_ = auVar146._0_4_ + -0.1;
        auVar71._4_4_ = auVar146._4_4_ + 0.1;
        auVar71._8_4_ = auVar146._8_4_ + 0.0;
        auVar71._12_4_ = auVar146._12_4_ + 0.0;
        auVar102 = vshufpd_avx(auVar189,auVar189,3);
        auVar210._8_8_ = 0x3f80000000000000;
        auVar210._0_8_ = 0x3f80000000000000;
        auVar146 = vcmpps_avx(auVar71,auVar210,1);
        auVar50._12_4_ = 0;
        auVar50._0_12_ = auVar71._4_12_;
        auVar205 = vinsertps_avx(auVar71,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar146 = vblendvps_avx(auVar205,auVar50 << 0x20,auVar146);
        auVar205 = vshufpd_avx(auVar124,auVar124,3);
        auVar134 = vshufps_avx(auVar146,auVar146,0x50);
        auVar211._8_4_ = 0x3f800000;
        auVar211._0_8_ = 0x3f8000003f800000;
        auVar211._12_4_ = 0x3f800000;
        auVar64 = vsubps_avx(auVar211,auVar134);
        local_540._0_4_ = auVar144._0_4_;
        local_540._4_4_ = auVar144._4_4_;
        fStack_538 = auVar144._8_4_;
        fStack_534 = auVar144._12_4_;
        fVar198 = auVar134._0_4_;
        fVar158 = auVar134._4_4_;
        fVar199 = auVar134._8_4_;
        fVar159 = auVar134._12_4_;
        local_5e0 = auVar65._0_4_;
        fStack_5dc = auVar65._4_4_;
        fStack_5d8 = auVar65._8_4_;
        fStack_5d4 = auVar65._12_4_;
        fVar201 = auVar64._0_4_;
        fVar215 = auVar64._4_4_;
        fVar216 = auVar64._8_4_;
        fVar217 = auVar64._12_4_;
        auVar72._0_4_ = fVar198 * (float)local_540._0_4_ + fVar201 * auVar209._0_4_;
        auVar72._4_4_ = fVar158 * (float)local_540._4_4_ + fVar215 * auVar209._4_4_;
        auVar72._8_4_ = fVar199 * fStack_538 + fVar216 * auVar209._0_4_;
        auVar72._12_4_ = fVar159 * fStack_534 + fVar217 * auVar209._4_4_;
        auVar137._0_4_ = fVar198 * auVar102._0_4_ + fVar201 * auVar189._0_4_;
        auVar137._4_4_ = fVar158 * auVar102._4_4_ + fVar215 * auVar189._4_4_;
        auVar137._8_4_ = fVar199 * auVar102._8_4_ + fVar216 * auVar189._0_4_;
        auVar137._12_4_ = fVar159 * auVar102._12_4_ + fVar217 * auVar189._4_4_;
        auVar191._0_4_ = fVar198 * auVar205._0_4_ + fVar201 * fVar91;
        auVar191._4_4_ = fVar158 * auVar205._4_4_ + fVar215 * fVar92;
        auVar191._8_4_ = fVar199 * auVar205._8_4_ + fVar216 * fVar91;
        auVar191._12_4_ = fVar159 * auVar205._12_4_ + fVar217 * fVar92;
        auVar227._0_4_ = fVar198 * local_5e0 + fVar201 * auVar213._16_4_;
        auVar227._4_4_ = fVar158 * fStack_5dc + fVar215 * auVar213._20_4_;
        auVar227._8_4_ = fVar199 * fStack_5d8 + fVar216 * auVar213._16_4_;
        auVar227._12_4_ = fVar159 * fStack_5d4 + fVar217 * auVar213._20_4_;
        auVar65 = vsubps_avx(auVar211,auVar146);
        auVar205 = vmovshdup_avx(auVar208);
        auVar144 = vmovsldup_avx(auVar208);
        auVar212._0_4_ = auVar144._0_4_ * auVar65._0_4_ + auVar146._0_4_ * auVar205._0_4_;
        auVar212._4_4_ = auVar144._4_4_ * auVar65._4_4_ + auVar146._4_4_ * auVar205._4_4_;
        auVar212._8_4_ = auVar144._8_4_ * auVar65._8_4_ + auVar146._8_4_ * auVar205._8_4_;
        auVar212._12_4_ = auVar144._12_4_ * auVar65._12_4_ + auVar146._12_4_ * auVar205._12_4_;
        auVar124 = vmovshdup_avx(auVar212);
        auVar146 = vsubps_avx(auVar137,auVar72);
        auVar154._0_4_ = auVar146._0_4_ * 3.0;
        auVar154._4_4_ = auVar146._4_4_ * 3.0;
        auVar154._8_4_ = auVar146._8_4_ * 3.0;
        auVar154._12_4_ = auVar146._12_4_ * 3.0;
        auVar146 = vsubps_avx(auVar191,auVar137);
        auVar233._0_4_ = auVar146._0_4_ * 3.0;
        auVar233._4_4_ = auVar146._4_4_ * 3.0;
        auVar233._8_4_ = auVar146._8_4_ * 3.0;
        auVar233._12_4_ = auVar146._12_4_ * 3.0;
        auVar146 = vsubps_avx(auVar227,auVar191);
        auVar252._0_4_ = auVar146._0_4_ * 3.0;
        auVar252._4_4_ = auVar146._4_4_ * 3.0;
        auVar252._8_4_ = auVar146._8_4_ * 3.0;
        auVar252._12_4_ = auVar146._12_4_ * 3.0;
        auVar205 = vminps_avx(auVar233,auVar252);
        auVar146 = vmaxps_avx(auVar233,auVar252);
        auVar205 = vminps_avx(auVar154,auVar205);
        auVar146 = vmaxps_avx(auVar154,auVar146);
        auVar144 = vshufpd_avx(auVar205,auVar205,3);
        auVar65 = vshufpd_avx(auVar146,auVar146,3);
        auVar205 = vminps_avx(auVar205,auVar144);
        auVar146 = vmaxps_avx(auVar146,auVar65);
        auVar144 = vshufps_avx(ZEXT416((uint)(1.0 / fVar197)),ZEXT416((uint)(1.0 / fVar197)),0);
        auVar234._0_4_ = auVar205._0_4_ * auVar144._0_4_;
        auVar234._4_4_ = auVar205._4_4_ * auVar144._4_4_;
        auVar234._8_4_ = auVar205._8_4_ * auVar144._8_4_;
        auVar234._12_4_ = auVar205._12_4_ * auVar144._12_4_;
        auVar253._0_4_ = auVar144._0_4_ * auVar146._0_4_;
        auVar253._4_4_ = auVar144._4_4_ * auVar146._4_4_;
        auVar253._8_4_ = auVar144._8_4_ * auVar146._8_4_;
        auVar253._12_4_ = auVar144._12_4_ * auVar146._12_4_;
        auVar64 = ZEXT416((uint)(1.0 / (auVar124._0_4_ - auVar212._0_4_)));
        auVar146 = vshufpd_avx(auVar72,auVar72,3);
        auVar205 = vshufpd_avx(auVar137,auVar137,3);
        auVar144 = vshufpd_avx(auVar191,auVar191,3);
        auVar65 = vshufpd_avx(auVar227,auVar227,3);
        auVar146 = vsubps_avx(auVar146,auVar72);
        auVar102 = vsubps_avx(auVar205,auVar137);
        auVar134 = vsubps_avx(auVar144,auVar191);
        auVar65 = vsubps_avx(auVar65,auVar227);
        auVar205 = vminps_avx(auVar146,auVar102);
        auVar146 = vmaxps_avx(auVar146,auVar102);
        auVar144 = vminps_avx(auVar134,auVar65);
        auVar144 = vminps_avx(auVar205,auVar144);
        auVar205 = vmaxps_avx(auVar134,auVar65);
        auVar146 = vmaxps_avx(auVar146,auVar205);
        auVar205 = vshufps_avx(auVar64,auVar64,0);
        auVar295._0_4_ = auVar205._0_4_ * auVar144._0_4_;
        auVar295._4_4_ = auVar205._4_4_ * auVar144._4_4_;
        auVar295._8_4_ = auVar205._8_4_ * auVar144._8_4_;
        auVar295._12_4_ = auVar205._12_4_ * auVar144._12_4_;
        auVar301._0_4_ = auVar205._0_4_ * auVar146._0_4_;
        auVar301._4_4_ = auVar205._4_4_ * auVar146._4_4_;
        auVar301._8_4_ = auVar205._8_4_ * auVar146._8_4_;
        auVar301._12_4_ = auVar205._12_4_ * auVar146._12_4_;
        auVar146 = vmovsldup_avx(auVar212);
        auVar267._4_12_ = auVar146._4_12_;
        auVar267._0_4_ = fVar157;
        auVar274._4_12_ = auVar212._4_12_;
        auVar274._0_4_ = fVar150;
        auVar155._0_4_ = (fVar157 + fVar150) * 0.5;
        auVar155._4_4_ = (auVar146._4_4_ + auVar212._4_4_) * 0.5;
        auVar155._8_4_ = (auVar146._8_4_ + auVar212._8_4_) * 0.5;
        auVar155._12_4_ = (auVar146._12_4_ + auVar212._12_4_) * 0.5;
        auVar146 = vshufps_avx(auVar155,auVar155,0);
        fVar198 = auVar146._0_4_;
        fVar158 = auVar146._4_4_;
        fVar199 = auVar146._8_4_;
        fVar159 = auVar146._12_4_;
        auVar103._0_4_ = (float)local_690._0_4_ + fVar198 * (float)local_350._0_4_;
        auVar103._4_4_ = (float)local_690._4_4_ + fVar158 * (float)local_350._4_4_;
        auVar103._8_4_ = fStack_688 + fVar199 * fStack_348;
        auVar103._12_4_ = fStack_684 + fVar159 * fStack_344;
        local_5f0._0_4_ = auVar273._0_4_;
        local_5f0._4_4_ = auVar273._4_4_;
        fStack_5e8 = auVar273._8_4_;
        fStack_5e4 = auVar273._12_4_;
        auVar138._0_4_ = fVar198 * (float)local_360._0_4_ + (float)local_5f0._0_4_;
        auVar138._4_4_ = fVar158 * (float)local_360._4_4_ + (float)local_5f0._4_4_;
        auVar138._8_4_ = fVar199 * fStack_358 + fStack_5e8;
        auVar138._12_4_ = fVar159 * fStack_354 + fStack_5e4;
        local_580 = auVar12._0_4_;
        fStack_57c = auVar12._4_4_;
        fStack_578 = auVar12._8_4_;
        fStack_574 = auVar12._12_4_;
        auVar192._0_4_ = fVar198 * (float)local_370._0_4_ + local_580;
        auVar192._4_4_ = fVar158 * (float)local_370._4_4_ + fStack_57c;
        auVar192._8_4_ = fVar199 * fStack_368 + fStack_578;
        auVar192._12_4_ = fVar159 * fStack_364 + fStack_574;
        auVar146 = vsubps_avx(auVar138,auVar103);
        auVar104._0_4_ = auVar103._0_4_ + fVar198 * auVar146._0_4_;
        auVar104._4_4_ = auVar103._4_4_ + fVar158 * auVar146._4_4_;
        auVar104._8_4_ = auVar103._8_4_ + fVar199 * auVar146._8_4_;
        auVar104._12_4_ = auVar103._12_4_ + fVar159 * auVar146._12_4_;
        auVar146 = vsubps_avx(auVar192,auVar138);
        auVar139._0_4_ = auVar138._0_4_ + fVar198 * auVar146._0_4_;
        auVar139._4_4_ = auVar138._4_4_ + fVar158 * auVar146._4_4_;
        auVar139._8_4_ = auVar138._8_4_ + fVar199 * auVar146._8_4_;
        auVar139._12_4_ = auVar138._12_4_ + fVar159 * auVar146._12_4_;
        auVar146 = vsubps_avx(auVar139,auVar104);
        fVar198 = auVar104._0_4_ + fVar198 * auVar146._0_4_;
        fVar158 = auVar104._4_4_ + fVar158 * auVar146._4_4_;
        auVar73._0_8_ = CONCAT44(fVar158,fVar198);
        auVar73._8_4_ = auVar104._8_4_ + fVar199 * auVar146._8_4_;
        auVar73._12_4_ = auVar104._12_4_ + fVar159 * auVar146._12_4_;
        fVar199 = auVar146._0_4_ * 3.0;
        fVar159 = auVar146._4_4_ * 3.0;
        auVar105._0_8_ = CONCAT44(fVar159,fVar199);
        auVar105._8_4_ = auVar146._8_4_ * 3.0;
        auVar105._12_4_ = auVar146._12_4_ * 3.0;
        auVar140._8_8_ = auVar73._0_8_;
        auVar140._0_8_ = auVar73._0_8_;
        auVar146 = vshufpd_avx(auVar73,auVar73,3);
        auVar205 = vshufps_avx(auVar155,auVar155,0x55);
        auVar134 = vsubps_avx(auVar146,auVar140);
        auVar283._0_4_ = auVar134._0_4_ * auVar205._0_4_ + fVar198;
        auVar283._4_4_ = auVar134._4_4_ * auVar205._4_4_ + fVar158;
        auVar283._8_4_ = auVar134._8_4_ * auVar205._8_4_ + fVar198;
        auVar283._12_4_ = auVar134._12_4_ * auVar205._12_4_ + fVar158;
        auVar141._8_8_ = auVar105._0_8_;
        auVar141._0_8_ = auVar105._0_8_;
        auVar146 = vshufpd_avx(auVar105,auVar105,1);
        auVar146 = vsubps_avx(auVar146,auVar141);
        auVar106._0_4_ = auVar146._0_4_ * auVar205._0_4_ + fVar199;
        auVar106._4_4_ = auVar146._4_4_ * auVar205._4_4_ + fVar159;
        auVar106._8_4_ = auVar146._8_4_ * auVar205._8_4_ + fVar199;
        auVar106._12_4_ = auVar146._12_4_ * auVar205._12_4_ + fVar159;
        auVar205 = vmovshdup_avx(auVar106);
        auVar193._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
        auVar193._8_4_ = auVar205._8_4_ ^ 0x80000000;
        auVar193._12_4_ = auVar205._12_4_ ^ 0x80000000;
        auVar144 = vmovshdup_avx(auVar134);
        auVar146 = vunpcklps_avx(auVar144,auVar193);
        auVar65 = vshufps_avx(auVar146,auVar193,4);
        auVar74._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
        auVar74._8_4_ = -auVar134._8_4_;
        auVar74._12_4_ = -auVar134._12_4_;
        auVar146 = vmovlhps_avx(auVar74,auVar106);
        auVar102 = vshufps_avx(auVar146,auVar106,8);
        auVar146 = ZEXT416((uint)(auVar106._0_4_ * auVar144._0_4_ - auVar134._0_4_ * auVar205._0_4_)
                          );
        auVar205 = vshufps_avx(auVar146,auVar146,0);
        auVar146 = vdivps_avx(auVar65,auVar205);
        auVar205 = vdivps_avx(auVar102,auVar205);
        auVar102 = vinsertps_avx(auVar234,auVar295,0x1c);
        auVar134 = vinsertps_avx(auVar253,auVar301,0x1c);
        auVar64 = vinsertps_avx(auVar295,auVar234,0x4c);
        auVar98 = vinsertps_avx(auVar301,auVar253,0x4c);
        auVar144 = vmovsldup_avx(auVar146);
        auVar254._0_4_ = auVar102._0_4_ * auVar144._0_4_;
        auVar254._4_4_ = auVar102._4_4_ * auVar144._4_4_;
        auVar254._8_4_ = auVar102._8_4_ * auVar144._8_4_;
        auVar254._12_4_ = auVar102._12_4_ * auVar144._12_4_;
        auVar107._0_4_ = auVar144._0_4_ * auVar134._0_4_;
        auVar107._4_4_ = auVar144._4_4_ * auVar134._4_4_;
        auVar107._8_4_ = auVar144._8_4_ * auVar134._8_4_;
        auVar107._12_4_ = auVar144._12_4_ * auVar134._12_4_;
        auVar65 = vminps_avx(auVar254,auVar107);
        auVar144 = vmaxps_avx(auVar107,auVar254);
        auVar125 = vmovsldup_avx(auVar205);
        auVar302._0_4_ = auVar125._0_4_ * auVar64._0_4_;
        auVar302._4_4_ = auVar125._4_4_ * auVar64._4_4_;
        auVar302._8_4_ = auVar125._8_4_ * auVar64._8_4_;
        auVar302._12_4_ = auVar125._12_4_ * auVar64._12_4_;
        auVar255._0_4_ = auVar125._0_4_ * auVar98._0_4_;
        auVar255._4_4_ = auVar125._4_4_ * auVar98._4_4_;
        auVar255._8_4_ = auVar125._8_4_ * auVar98._8_4_;
        auVar255._12_4_ = auVar125._12_4_ * auVar98._12_4_;
        auVar125 = vminps_avx(auVar302,auVar255);
        auVar169._0_4_ = auVar65._0_4_ + auVar125._0_4_;
        auVar169._4_4_ = auVar65._4_4_ + auVar125._4_4_;
        auVar169._8_4_ = auVar65._8_4_ + auVar125._8_4_;
        auVar169._12_4_ = auVar65._12_4_ + auVar125._12_4_;
        auVar65 = vmaxps_avx(auVar255,auVar302);
        auVar125 = vsubps_avx(auVar267,auVar155);
        auVar126 = vsubps_avx(auVar274,auVar155);
        auVar108._0_4_ = auVar65._0_4_ + auVar144._0_4_;
        auVar108._4_4_ = auVar65._4_4_ + auVar144._4_4_;
        auVar108._8_4_ = auVar65._8_4_ + auVar144._8_4_;
        auVar108._12_4_ = auVar65._12_4_ + auVar144._12_4_;
        auVar275._8_8_ = 0x3f800000;
        auVar275._0_8_ = 0x3f800000;
        auVar144 = vsubps_avx(auVar275,auVar108);
        auVar65 = vsubps_avx(auVar275,auVar169);
        fVar216 = auVar125._0_4_;
        auVar276._0_4_ = fVar216 * auVar144._0_4_;
        fVar217 = auVar125._4_4_;
        auVar276._4_4_ = fVar217 * auVar144._4_4_;
        fVar91 = auVar125._8_4_;
        auVar276._8_4_ = fVar91 * auVar144._8_4_;
        fVar92 = auVar125._12_4_;
        auVar276._12_4_ = fVar92 * auVar144._12_4_;
        fVar199 = auVar126._0_4_;
        auVar109._0_4_ = fVar199 * auVar144._0_4_;
        fVar159 = auVar126._4_4_;
        auVar109._4_4_ = fVar159 * auVar144._4_4_;
        fVar201 = auVar126._8_4_;
        auVar109._8_4_ = fVar201 * auVar144._8_4_;
        fVar215 = auVar126._12_4_;
        auVar109._12_4_ = fVar215 * auVar144._12_4_;
        auVar296._0_4_ = fVar216 * auVar65._0_4_;
        auVar296._4_4_ = fVar217 * auVar65._4_4_;
        auVar296._8_4_ = fVar91 * auVar65._8_4_;
        auVar296._12_4_ = fVar92 * auVar65._12_4_;
        auVar170._0_4_ = fVar199 * auVar65._0_4_;
        auVar170._4_4_ = fVar159 * auVar65._4_4_;
        auVar170._8_4_ = fVar201 * auVar65._8_4_;
        auVar170._12_4_ = fVar215 * auVar65._12_4_;
        auVar144 = vminps_avx(auVar276,auVar296);
        auVar65 = vminps_avx(auVar109,auVar170);
        auVar125 = vminps_avx(auVar144,auVar65);
        auVar144 = vmaxps_avx(auVar296,auVar276);
        auVar65 = vmaxps_avx(auVar170,auVar109);
        auVar126 = vshufps_avx(auVar155,auVar155,0x54);
        auVar65 = vmaxps_avx(auVar65,auVar144);
        auVar127 = vshufps_avx(auVar283,auVar283,0);
        auVar151 = vshufps_avx(auVar283,auVar283,0x55);
        auVar144 = vhaddps_avx(auVar125,auVar125);
        auVar65 = vhaddps_avx(auVar65,auVar65);
        auVar171._0_4_ = auVar151._0_4_ * auVar205._0_4_ + auVar127._0_4_ * auVar146._0_4_;
        auVar171._4_4_ = auVar151._4_4_ * auVar205._4_4_ + auVar127._4_4_ * auVar146._4_4_;
        auVar171._8_4_ = auVar151._8_4_ * auVar205._8_4_ + auVar127._8_4_ * auVar146._8_4_;
        auVar171._12_4_ = auVar151._12_4_ * auVar205._12_4_ + auVar127._12_4_ * auVar146._12_4_;
        auVar125 = vsubps_avx(auVar126,auVar171);
        fVar198 = auVar125._0_4_ + auVar144._0_4_;
        fVar158 = auVar125._0_4_ + auVar65._0_4_;
        auVar144 = vmaxss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar198));
        auVar65 = vminss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar150));
      } while (auVar65._0_4_ < auVar144._0_4_);
      auVar144 = vmovshdup_avx(auVar146);
      auVar172._0_4_ = auVar102._0_4_ * auVar144._0_4_;
      auVar172._4_4_ = auVar102._4_4_ * auVar144._4_4_;
      auVar172._8_4_ = auVar102._8_4_ * auVar144._8_4_;
      auVar172._12_4_ = auVar102._12_4_ * auVar144._12_4_;
      auVar110._0_4_ = auVar144._0_4_ * auVar134._0_4_;
      auVar110._4_4_ = auVar144._4_4_ * auVar134._4_4_;
      auVar110._8_4_ = auVar144._8_4_ * auVar134._8_4_;
      auVar110._12_4_ = auVar144._12_4_ * auVar134._12_4_;
      auVar65 = vminps_avx(auVar172,auVar110);
      auVar144 = vmaxps_avx(auVar110,auVar172);
      auVar102 = vmovshdup_avx(auVar205);
      auVar75._0_4_ = auVar102._0_4_ * auVar64._0_4_;
      auVar75._4_4_ = auVar102._4_4_ * auVar64._4_4_;
      auVar75._8_4_ = auVar102._8_4_ * auVar64._8_4_;
      auVar75._12_4_ = auVar102._12_4_ * auVar64._12_4_;
      auVar173._0_4_ = auVar98._0_4_ * auVar102._0_4_;
      auVar173._4_4_ = auVar98._4_4_ * auVar102._4_4_;
      auVar173._8_4_ = auVar98._8_4_ * auVar102._8_4_;
      auVar173._12_4_ = auVar98._12_4_ * auVar102._12_4_;
      auVar102 = vminps_avx(auVar75,auVar173);
      auVar142._0_4_ = auVar65._0_4_ + auVar102._0_4_;
      auVar142._4_4_ = auVar65._4_4_ + auVar102._4_4_;
      auVar142._8_4_ = auVar65._8_4_ + auVar102._8_4_;
      auVar142._12_4_ = auVar65._12_4_ + auVar102._12_4_;
      auVar65 = vmaxps_avx(auVar173,auVar75);
      auVar76._0_4_ = auVar144._0_4_ + auVar65._0_4_;
      auVar76._4_4_ = auVar144._4_4_ + auVar65._4_4_;
      auVar76._8_4_ = auVar144._8_4_ + auVar65._8_4_;
      auVar76._12_4_ = auVar144._12_4_ + auVar65._12_4_;
      auVar144 = vsubps_avx(auVar210,auVar76);
      auVar65 = vsubps_avx(auVar210,auVar142);
      auVar143._0_4_ = fVar216 * auVar144._0_4_;
      auVar143._4_4_ = fVar217 * auVar144._4_4_;
      auVar143._8_4_ = fVar91 * auVar144._8_4_;
      auVar143._12_4_ = fVar92 * auVar144._12_4_;
      auVar174._0_4_ = fVar216 * auVar65._0_4_;
      auVar174._4_4_ = fVar217 * auVar65._4_4_;
      auVar174._8_4_ = fVar91 * auVar65._8_4_;
      auVar174._12_4_ = fVar92 * auVar65._12_4_;
      auVar77._0_4_ = fVar199 * auVar144._0_4_;
      auVar77._4_4_ = fVar159 * auVar144._4_4_;
      auVar77._8_4_ = fVar201 * auVar144._8_4_;
      auVar77._12_4_ = fVar215 * auVar144._12_4_;
      auVar111._0_4_ = fVar199 * auVar65._0_4_;
      auVar111._4_4_ = fVar159 * auVar65._4_4_;
      auVar111._8_4_ = fVar201 * auVar65._8_4_;
      auVar111._12_4_ = fVar215 * auVar65._12_4_;
      auVar144 = vminps_avx(auVar143,auVar174);
      auVar65 = vminps_avx(auVar77,auVar111);
      auVar144 = vminps_avx(auVar144,auVar65);
      auVar65 = vmaxps_avx(auVar174,auVar143);
      auVar102 = vmaxps_avx(auVar111,auVar77);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar65 = vmaxps_avx(auVar102,auVar65);
      auVar65 = vhaddps_avx(auVar65,auVar65);
      auVar102 = vmovshdup_avx(auVar125);
      auVar214 = ZEXT1664(auVar212);
      auVar134 = ZEXT416((uint)(auVar102._0_4_ + auVar144._0_4_));
      auVar144 = vmaxss_avx(auVar212,auVar134);
      auVar102 = ZEXT416((uint)(auVar102._0_4_ + auVar65._0_4_));
      auVar65 = vminss_avx(auVar102,auVar124);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
    } while (auVar65._0_4_ < auVar144._0_4_);
    uVar59 = 0;
    if ((fVar157 < fVar198) && (fVar158 < fVar150)) {
      auVar144 = vcmpps_avx(auVar102,auVar124,1);
      auVar65 = vcmpps_avx(auVar212,auVar134,1);
      auVar144 = vandps_avx(auVar65,auVar144);
      uVar59 = auVar144._0_4_;
    }
    if ((3 < uVar61 || fVar197 < 0.001) || (uVar59 & 1) != 0) {
      lVar56 = 200;
      do {
        fVar197 = auVar125._0_4_;
        fVar150 = 1.0 - fVar197;
        auVar144 = ZEXT416((uint)(fVar150 * fVar150 * fVar150));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar65 = ZEXT416((uint)(fVar197 * 3.0 * fVar150 * fVar150));
        auVar65 = vshufps_avx(auVar65,auVar65,0);
        auVar102 = ZEXT416((uint)(fVar150 * fVar197 * fVar197 * 3.0));
        auVar102 = vshufps_avx(auVar102,auVar102,0);
        auVar134 = ZEXT416((uint)(fVar197 * fVar197 * fVar197));
        auVar134 = vshufps_avx(auVar134,auVar134,0);
        fVar150 = (float)local_690._0_4_ * auVar144._0_4_ +
                  (float)local_5f0._0_4_ * auVar65._0_4_ +
                  (float)local_4b0._0_4_ * auVar134._0_4_ + local_580 * auVar102._0_4_;
        fVar197 = (float)local_690._4_4_ * auVar144._4_4_ +
                  (float)local_5f0._4_4_ * auVar65._4_4_ +
                  (float)local_4b0._4_4_ * auVar134._4_4_ + fStack_57c * auVar102._4_4_;
        auVar78._0_8_ = CONCAT44(fVar197,fVar150);
        auVar78._8_4_ =
             fStack_688 * auVar144._8_4_ +
             fStack_5e8 * auVar65._8_4_ + fStack_4a8 * auVar134._8_4_ + fStack_578 * auVar102._8_4_;
        auVar78._12_4_ =
             fStack_684 * auVar144._12_4_ +
             fStack_5e4 * auVar65._12_4_ +
             fStack_4a4 * auVar134._12_4_ + fStack_574 * auVar102._12_4_;
        auVar112._8_8_ = auVar78._0_8_;
        auVar112._0_8_ = auVar78._0_8_;
        auVar65 = vshufpd_avx(auVar78,auVar78,1);
        auVar144 = vmovshdup_avx(auVar125);
        auVar65 = vsubps_avx(auVar65,auVar112);
        auVar79._0_4_ = auVar144._0_4_ * auVar65._0_4_ + fVar150;
        auVar79._4_4_ = auVar144._4_4_ * auVar65._4_4_ + fVar197;
        auVar79._8_4_ = auVar144._8_4_ * auVar65._8_4_ + fVar150;
        auVar79._12_4_ = auVar144._12_4_ * auVar65._12_4_ + fVar197;
        auVar144 = vshufps_avx(auVar79,auVar79,0);
        auVar65 = vshufps_avx(auVar79,auVar79,0x55);
        auVar113._0_4_ = auVar146._0_4_ * auVar144._0_4_ + auVar205._0_4_ * auVar65._0_4_;
        auVar113._4_4_ = auVar146._4_4_ * auVar144._4_4_ + auVar205._4_4_ * auVar65._4_4_;
        auVar113._8_4_ = auVar146._8_4_ * auVar144._8_4_ + auVar205._8_4_ * auVar65._8_4_;
        auVar113._12_4_ = auVar146._12_4_ * auVar144._12_4_ + auVar205._12_4_ * auVar65._12_4_;
        auVar125 = vsubps_avx(auVar125,auVar113);
        auVar144 = vandps_avx(auVar235,auVar79);
        auVar65 = vshufps_avx(auVar144,auVar144,0xf5);
        auVar144 = vmaxss_avx(auVar65,auVar144);
        if (auVar144._0_4_ < (float)local_4c0._0_4_) {
          fVar150 = auVar125._0_4_;
          if ((0.0 <= fVar150) && (fVar150 <= 1.0)) {
            auVar146 = vmovshdup_avx(auVar125);
            fVar197 = auVar146._0_4_;
            if ((0.0 <= fVar197) && (fVar197 <= 1.0)) {
              auVar146 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                       ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar98 = vinsertps_avx(auVar146,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar146 = vdpps_avx(auVar98,local_380,0x7f);
              auVar205 = vdpps_avx(auVar98,local_390,0x7f);
              auVar144 = vdpps_avx(auVar98,local_3c0,0x7f);
              auVar65 = vdpps_avx(auVar98,local_3d0,0x7f);
              auVar102 = vdpps_avx(auVar98,local_3e0,0x7f);
              auVar134 = vdpps_avx(auVar98,local_3f0,0x7f);
              fVar159 = 1.0 - fVar197;
              auVar64 = vdpps_avx(auVar98,local_3a0,0x7f);
              auVar98 = vdpps_avx(auVar98,local_3b0,0x7f);
              fVar201 = 1.0 - fVar150;
              fVar157 = auVar125._4_4_;
              fVar198 = auVar125._8_4_;
              fVar158 = auVar125._12_4_;
              fVar199 = fVar201 * fVar150 * fVar150 * 3.0;
              auVar194._0_4_ = fVar150 * fVar150 * fVar150;
              auVar194._4_4_ = fVar157 * fVar157 * fVar157;
              auVar194._8_4_ = fVar198 * fVar198 * fVar198;
              auVar194._12_4_ = fVar158 * fVar158 * fVar158;
              fVar157 = fVar150 * 3.0 * fVar201 * fVar201;
              fVar198 = fVar201 * fVar201 * fVar201;
              fVar150 = (fVar159 * auVar146._0_4_ + fVar197 * auVar144._0_4_) * fVar198 +
                        (fVar159 * auVar205._0_4_ + fVar197 * auVar65._0_4_) * fVar157 +
                        fVar199 * (fVar159 * auVar64._0_4_ + fVar197 * auVar102._0_4_) +
                        auVar194._0_4_ * (auVar134._0_4_ * fVar197 + fVar159 * auVar98._0_4_);
              if ((fVar179 <= fVar150) &&
                 (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar150 <= fVar197)) {
                pGVar5 = (context->scene->geometries).items[uVar53].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_00e41211:
                  bVar54 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar54 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar125,auVar125,0x55);
                  auVar236._8_4_ = 0x3f800000;
                  auVar236._0_8_ = 0x3f8000003f800000;
                  auVar236._12_4_ = 0x3f800000;
                  auVar146 = vsubps_avx(auVar236,local_f0);
                  fVar158 = local_f0._0_4_;
                  fVar159 = local_f0._4_4_;
                  fVar215 = local_f0._8_4_;
                  fVar216 = local_f0._12_4_;
                  fVar217 = auVar146._0_4_;
                  fVar91 = auVar146._4_4_;
                  fVar92 = auVar146._8_4_;
                  fVar93 = auVar146._12_4_;
                  auVar256._0_4_ =
                       fVar158 * (float)local_4e0._0_4_ + fVar217 * (float)local_4d0._0_4_;
                  auVar256._4_4_ =
                       fVar159 * (float)local_4e0._4_4_ + fVar91 * (float)local_4d0._4_4_;
                  auVar256._8_4_ = fVar215 * fStack_4d8 + fVar92 * fStack_4c8;
                  auVar256._12_4_ = fVar216 * fStack_4d4 + fVar93 * fStack_4c4;
                  auVar268._0_4_ =
                       fVar158 * (float)local_520._0_4_ + fVar217 * (float)local_500._0_4_;
                  auVar268._4_4_ =
                       fVar159 * (float)local_520._4_4_ + fVar91 * (float)local_500._4_4_;
                  auVar268._8_4_ = fVar215 * fStack_518 + fVar92 * fStack_4f8;
                  auVar268._12_4_ = fVar216 * fStack_514 + fVar93 * fStack_4f4;
                  auVar277._0_4_ =
                       fVar158 * (float)local_420._0_4_ + fVar217 * (float)local_510._0_4_;
                  auVar277._4_4_ =
                       fVar159 * (float)local_420._4_4_ + fVar91 * (float)local_510._4_4_;
                  auVar277._8_4_ = fVar215 * fStack_418 + fVar92 * fStack_508;
                  auVar277._12_4_ = fVar216 * fStack_414 + fVar93 * fStack_504;
                  auVar237._0_4_ = fVar158 * fVar63 + fVar217 * (float)local_4f0._0_4_;
                  auVar237._4_4_ = fVar159 * fVar88 + fVar91 * (float)local_4f0._4_4_;
                  auVar237._8_4_ = fVar215 * fVar89 + fVar92 * fStack_4e8;
                  auVar237._12_4_ = fVar216 * fVar90 + fVar93 * fStack_4e4;
                  auVar65 = vsubps_avx(auVar268,auVar256);
                  auVar102 = vsubps_avx(auVar277,auVar268);
                  auVar134 = vsubps_avx(auVar237,auVar277);
                  local_110 = vshufps_avx(auVar125,auVar125,0);
                  fVar158 = local_110._0_4_;
                  fVar215 = local_110._4_4_;
                  fVar216 = local_110._8_4_;
                  fVar91 = local_110._12_4_;
                  auVar146 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                  fVar159 = auVar146._0_4_;
                  fVar201 = auVar146._4_4_;
                  fVar217 = auVar146._8_4_;
                  fVar92 = auVar146._12_4_;
                  auVar146 = vshufps_avx(auVar194,auVar194,0);
                  auVar205 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
                  auVar144 = vshufps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),0);
                  auVar175._0_4_ =
                       ((auVar102._0_4_ * fVar159 + auVar134._0_4_ * fVar158) * fVar158 +
                       (auVar65._0_4_ * fVar159 + auVar102._0_4_ * fVar158) * fVar159) * 3.0;
                  auVar175._4_4_ =
                       ((auVar102._4_4_ * fVar201 + auVar134._4_4_ * fVar215) * fVar215 +
                       (auVar65._4_4_ * fVar201 + auVar102._4_4_ * fVar215) * fVar201) * 3.0;
                  auVar175._8_4_ =
                       ((auVar102._8_4_ * fVar217 + auVar134._8_4_ * fVar216) * fVar216 +
                       (auVar65._8_4_ * fVar217 + auVar102._8_4_ * fVar216) * fVar217) * 3.0;
                  auVar175._12_4_ =
                       ((auVar102._12_4_ * fVar92 + auVar134._12_4_ * fVar91) * fVar91 +
                       (auVar65._12_4_ * fVar92 + auVar102._12_4_ * fVar91) * fVar92) * 3.0;
                  auVar65 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
                  auVar114._0_4_ =
                       auVar65._0_4_ * (float)local_430._0_4_ +
                       auVar144._0_4_ * (float)local_440._0_4_ +
                       auVar146._0_4_ * (float)local_460._0_4_ +
                       auVar205._0_4_ * (float)local_450._0_4_;
                  auVar114._4_4_ =
                       auVar65._4_4_ * (float)local_430._4_4_ +
                       auVar144._4_4_ * (float)local_440._4_4_ +
                       auVar146._4_4_ * (float)local_460._4_4_ +
                       auVar205._4_4_ * (float)local_450._4_4_;
                  auVar114._8_4_ =
                       auVar65._8_4_ * fStack_428 +
                       auVar144._8_4_ * fStack_438 +
                       auVar146._8_4_ * fStack_458 + auVar205._8_4_ * fStack_448;
                  auVar114._12_4_ =
                       auVar65._12_4_ * fStack_424 +
                       auVar144._12_4_ * fStack_434 +
                       auVar146._12_4_ * fStack_454 + auVar205._12_4_ * fStack_444;
                  auVar146 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar145._0_4_ = auVar114._0_4_ * auVar146._0_4_;
                  auVar145._4_4_ = auVar114._4_4_ * auVar146._4_4_;
                  auVar145._8_4_ = auVar114._8_4_ * auVar146._8_4_;
                  auVar145._12_4_ = auVar114._12_4_ * auVar146._12_4_;
                  auVar146 = vshufps_avx(auVar114,auVar114,0xc9);
                  auVar115._0_4_ = auVar175._0_4_ * auVar146._0_4_;
                  auVar115._4_4_ = auVar175._4_4_ * auVar146._4_4_;
                  auVar115._8_4_ = auVar175._8_4_ * auVar146._8_4_;
                  auVar115._12_4_ = auVar175._12_4_ * auVar146._12_4_;
                  auVar146 = vsubps_avx(auVar115,auVar145);
                  local_170 = vshufps_avx(auVar146,auVar146,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar146,auVar146,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar146,auVar146,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_300._0_8_;
                  uStack_d8 = local_300._8_8_;
                  uStack_d0 = local_300._16_8_;
                  uStack_c8 = local_300._24_8_;
                  local_c0 = local_2e0._0_8_;
                  uStack_b8 = local_2e0._8_8_;
                  uStack_b0 = local_2e0._16_8_;
                  uStack_a8 = local_2e0._24_8_;
                  auVar81 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar150;
                  local_560 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar58 & 0xf) << 4));
                  local_550 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar58 >> 4) * 0x10);
                  local_490.valid = (int *)local_560;
                  local_490.geometryUserPtr = pGVar5->userPtr;
                  local_490.context = context->user;
                  local_490.ray = (RTCRayN *)ray;
                  local_490.hit = local_180;
                  local_490.N = 8;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&local_490);
                  }
                  auVar146 = vpcmpeqd_avx(local_560,ZEXT816(0) << 0x40);
                  auVar205 = vpcmpeqd_avx(local_550,ZEXT816(0) << 0x40);
                  auVar149._16_16_ = auVar205;
                  auVar149._0_16_ = auVar146;
                  auVar15 = auVar81 & ~auVar149;
                  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar15 >> 0x7f,0) != '\0') ||
                        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar15 >> 0xbf,0) != '\0') ||
                      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar15[0x1f] < '\0') {
                    p_Var6 = context->args->filter;
                    if (p_Var6 == (RTCFilterFunctionN)0x0) {
                      auVar146 = SUB6416(ZEXT864(0),0) << 0x20;
                    }
                    else {
                      auVar146 = SUB6416(ZEXT864(0),0) << 0x20;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var6)(&local_490);
                        auVar146 = ZEXT816(0) << 0x40;
                      }
                    }
                    auVar205 = vpcmpeqd_avx(local_560,auVar146);
                    auVar146 = vpcmpeqd_avx(local_550,auVar146);
                    auVar87._16_16_ = auVar146;
                    auVar87._0_16_ = auVar205;
                    auVar120._8_4_ = 0xff800000;
                    auVar120._0_8_ = 0xff800000ff800000;
                    auVar120._12_4_ = 0xff800000;
                    auVar120._16_4_ = 0xff800000;
                    auVar120._20_4_ = 0xff800000;
                    auVar120._24_4_ = 0xff800000;
                    auVar120._28_4_ = 0xff800000;
                    auVar15 = vblendvps_avx(auVar120,*(undefined1 (*) [32])(local_490.ray + 0x100),
                                            auVar87);
                    *(undefined1 (*) [32])(local_490.ray + 0x100) = auVar15;
                    auVar81 = auVar81 & ~auVar87;
                    if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar81 >> 0x7f,0) != '\0') ||
                          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar81 >> 0xbf,0) != '\0') ||
                        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar81[0x1f] < '\0') {
                      bVar54 = 1;
                      goto LAB_00e41213;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar197;
                  goto LAB_00e41211;
                }
LAB_00e41213:
                bVar62 = (bool)(bVar62 | bVar54);
              }
            }
          }
          break;
        }
        lVar56 = lVar56 + -1;
      } while (lVar56 != 0);
      goto LAB_00e4012f;
    }
    auVar146 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar150),0x10);
    auVar297 = ZEXT1664(auVar146);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }